

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  uint uVar46;
  int iVar47;
  ulong uVar48;
  long lVar49;
  byte bVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  float fVar56;
  undefined4 uVar57;
  float fVar58;
  float fVar59;
  float fVar81;
  float fVar83;
  vint4 bi_2;
  float fVar84;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar82;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined8 uVar85;
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  vint4 ai_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar138;
  vint4 ai;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar154;
  float fVar172;
  float fVar173;
  vfloat4 b0_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar174;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar185;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar178 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar186;
  undefined1 auVar184 [32];
  float fVar190;
  float fVar202;
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar203;
  float fVar218;
  vfloat4 a0_2;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar219;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  vfloat4 a0_3;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar238;
  float fVar251;
  float fVar252;
  vfloat4 a0_1;
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  float fVar253;
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar241 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  vfloat4 a0;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_700 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar275 [32];
  
  PVar2 = prim[1];
  uVar54 = (ulong)(byte)PVar2;
  fVar56 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  auVar234._0_4_ = fVar56 * auVar8._0_4_;
  auVar234._4_4_ = fVar56 * auVar8._4_4_;
  auVar234._8_4_ = fVar56 * auVar8._8_4_;
  auVar234._12_4_ = fVar56 * auVar8._12_4_;
  auVar118._0_4_ = fVar56 * auVar9._0_4_;
  auVar118._4_4_ = fVar56 * auVar9._4_4_;
  auVar118._8_4_ = fVar56 * auVar9._8_4_;
  auVar118._12_4_ = fVar56 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar54 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar48 = (ulong)(uint)((int)(uVar54 * 9) * 2);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 + uVar54 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar48 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar263._4_4_ = auVar118._0_4_;
  auVar263._0_4_ = auVar118._0_4_;
  auVar263._8_4_ = auVar118._0_4_;
  auVar263._12_4_ = auVar118._0_4_;
  auVar87 = vshufps_avx(auVar118,auVar118,0x55);
  auVar242 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar56 = auVar242._0_4_;
  auVar232._0_4_ = fVar56 * auVar121._0_4_;
  fVar81 = auVar242._4_4_;
  auVar232._4_4_ = fVar81 * auVar121._4_4_;
  fVar83 = auVar242._8_4_;
  auVar232._8_4_ = fVar83 * auVar121._8_4_;
  fVar84 = auVar242._12_4_;
  auVar232._12_4_ = fVar84 * auVar121._12_4_;
  auVar220._0_4_ = auVar13._0_4_ * fVar56;
  auVar220._4_4_ = auVar13._4_4_ * fVar81;
  auVar220._8_4_ = auVar13._8_4_ * fVar83;
  auVar220._12_4_ = auVar13._12_4_ * fVar84;
  auVar191._0_4_ = auVar106._0_4_ * fVar56;
  auVar191._4_4_ = auVar106._4_4_ * fVar81;
  auVar191._8_4_ = auVar106._8_4_ * fVar83;
  auVar191._12_4_ = auVar106._12_4_ * fVar84;
  auVar242 = vfmadd231ps_fma(auVar232,auVar87,auVar9);
  auVar88 = vfmadd231ps_fma(auVar220,auVar87,auVar12);
  auVar87 = vfmadd231ps_fma(auVar191,auVar60,auVar87);
  auVar116 = vfmadd231ps_fma(auVar242,auVar263,auVar8);
  auVar88 = vfmadd231ps_fma(auVar88,auVar263,auVar11);
  auVar130 = vfmadd231ps_fma(auVar87,auVar61,auVar263);
  auVar264._4_4_ = auVar234._0_4_;
  auVar264._0_4_ = auVar234._0_4_;
  auVar264._8_4_ = auVar234._0_4_;
  auVar264._12_4_ = auVar234._0_4_;
  auVar87 = vshufps_avx(auVar234,auVar234,0x55);
  auVar242 = vshufps_avx(auVar234,auVar234,0xaa);
  fVar56 = auVar242._0_4_;
  auVar139._0_4_ = fVar56 * auVar121._0_4_;
  fVar81 = auVar242._4_4_;
  auVar139._4_4_ = fVar81 * auVar121._4_4_;
  fVar83 = auVar242._8_4_;
  auVar139._8_4_ = fVar83 * auVar121._8_4_;
  fVar84 = auVar242._12_4_;
  auVar139._12_4_ = fVar84 * auVar121._12_4_;
  auVar86._0_4_ = auVar13._0_4_ * fVar56;
  auVar86._4_4_ = auVar13._4_4_ * fVar81;
  auVar86._8_4_ = auVar13._8_4_ * fVar83;
  auVar86._12_4_ = auVar13._12_4_ * fVar84;
  auVar242._0_4_ = auVar106._0_4_ * fVar56;
  auVar242._4_4_ = auVar106._4_4_ * fVar81;
  auVar242._8_4_ = auVar106._8_4_ * fVar83;
  auVar242._12_4_ = auVar106._12_4_ * fVar84;
  auVar9 = vfmadd231ps_fma(auVar139,auVar87,auVar9);
  auVar121 = vfmadd231ps_fma(auVar86,auVar87,auVar12);
  auVar12 = vfmadd231ps_fma(auVar242,auVar87,auVar60);
  auVar13 = vfmadd231ps_fma(auVar9,auVar264,auVar8);
  auVar60 = vfmadd231ps_fma(auVar121,auVar264,auVar11);
  auVar106 = vfmadd231ps_fma(auVar12,auVar264,auVar61);
  local_510._8_4_ = 0x7fffffff;
  local_510._0_8_ = 0x7fffffff7fffffff;
  local_510._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar116,local_510);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar129,1);
  auVar9 = vblendvps_avx(auVar116,auVar129,auVar8);
  auVar8 = vandps_avx(auVar88,local_510);
  auVar8 = vcmpps_avx(auVar8,auVar129,1);
  auVar121 = vblendvps_avx(auVar88,auVar129,auVar8);
  auVar8 = vandps_avx(auVar130,local_510);
  auVar8 = vcmpps_avx(auVar8,auVar129,1);
  auVar8 = vblendvps_avx(auVar130,auVar129,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar175._8_4_ = 0x3f800000;
  auVar175._0_8_ = 0x3f8000003f800000;
  auVar175._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar175);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar121);
  auVar121 = vfnmadd213ps_fma(auVar121,auVar9,auVar175);
  auVar12 = vfmadd132ps_fma(auVar121,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar175);
  auVar61 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar130._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar130._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar130._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar130._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar140._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar140._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar140._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar140._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar88._1_3_ = 0;
  auVar88[0] = PVar2;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar121);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar54 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar60);
  auVar192._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar192._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar192._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar192._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar60);
  auVar87._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar87._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar87._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar87._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 + uVar54 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar106);
  auVar116._0_4_ = auVar61._0_4_ * auVar8._0_4_;
  auVar116._4_4_ = auVar61._4_4_ * auVar8._4_4_;
  auVar116._8_4_ = auVar61._8_4_ * auVar8._8_4_;
  auVar116._12_4_ = auVar61._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar106);
  auVar60._0_4_ = auVar61._0_4_ * auVar8._0_4_;
  auVar60._4_4_ = auVar61._4_4_ * auVar8._4_4_;
  auVar60._8_4_ = auVar61._8_4_ * auVar8._8_4_;
  auVar60._12_4_ = auVar61._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar130,auVar140);
  auVar9 = vpminsd_avx(auVar192,auVar87);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar116,auVar60);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar204._4_4_ = uVar57;
  auVar204._0_4_ = uVar57;
  auVar204._8_4_ = uVar57;
  auVar204._12_4_ = uVar57;
  auVar9 = vmaxps_avx(auVar9,auVar204);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_490._0_4_ = auVar8._0_4_ * 0.99999964;
  local_490._4_4_ = auVar8._4_4_ * 0.99999964;
  local_490._8_4_ = auVar8._8_4_ * 0.99999964;
  local_490._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar130,auVar140);
  auVar9 = vpmaxsd_avx(auVar192,auVar87);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar116,auVar60);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar106._4_4_ = uVar57;
  auVar106._0_4_ = uVar57;
  auVar106._8_4_ = uVar57;
  auVar106._12_4_ = uVar57;
  auVar9 = vminps_avx(auVar9,auVar106);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar61._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar61._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar61._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar61._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar88[4] = PVar2;
  auVar88._5_3_ = 0;
  auVar88[8] = PVar2;
  auVar88._9_3_ = 0;
  auVar88[0xc] = PVar2;
  auVar88._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar88,_DAT_01f7fcf0);
  auVar8 = vcmpps_avx(local_490,auVar61,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar46 = vmovmskps_avx(auVar8);
  if (uVar46 == 0) {
    return;
  }
  uVar46 = uVar46 & 0xff;
  auVar76._16_16_ = mm_lookupmask_ps._240_16_;
  auVar76._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar76,ZEXT832(0) << 0x20,0x80);
  iVar47 = 1 << ((uint)k & 0x1f);
  auVar77._4_4_ = iVar47;
  auVar77._0_4_ = iVar47;
  auVar77._8_4_ = iVar47;
  auVar77._12_4_ = iVar47;
  auVar77._16_4_ = iVar47;
  auVar77._20_4_ = iVar47;
  auVar77._24_4_ = iVar47;
  auVar77._28_4_ = iVar47;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar76 = vpand_avx2(auVar77,auVar15);
  local_360 = vpcmpeqd_avx2(auVar76,auVar15);
  do {
    lVar49 = 0;
    uVar54 = (ulong)uVar46;
    for (uVar48 = uVar54; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
      lVar49 = lVar49 + 1;
    }
    uVar46 = *(uint *)(prim + 2);
    uVar3 = *(uint *)(prim + lVar49 * 4 + 6);
    pGVar4 = (context->scene->geometries).items[uVar46].ptr;
    uVar48 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar3);
    p_Var5 = pGVar4[1].intersectionFilterN;
    pvVar6 = pGVar4[2].userPtr;
    _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar8 = *(undefined1 (*) [16])(_Var7 + uVar48 * (long)pvVar6);
    auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar48 + 1) * (long)pvVar6);
    auVar121 = *(undefined1 (*) [16])(_Var7 + (uVar48 + 2) * (long)pvVar6);
    auVar11 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar48 + 3));
    lVar49 = *(long *)&pGVar4[1].time_range.upper;
    auVar12 = *(undefined1 (*) [16])(lVar49 + (long)p_Var5 * uVar48);
    auVar13 = *(undefined1 (*) [16])(lVar49 + (long)p_Var5 * (uVar48 + 1));
    auVar61 = *(undefined1 (*) [16])(lVar49 + (long)p_Var5 * (uVar48 + 2));
    uVar54 = uVar54 - 1 & uVar54;
    auVar60 = *(undefined1 (*) [16])(lVar49 + (long)p_Var5 * (uVar48 + 3));
    if (uVar54 != 0) {
      uVar53 = uVar54 - 1 & uVar54;
      for (uVar48 = uVar54; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
      }
      if (uVar53 != 0) {
        for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar116 = ZEXT816(0) << 0x40;
    auVar89._0_4_ = auVar60._0_4_ * 0.0;
    auVar89._4_4_ = auVar60._4_4_ * 0.0;
    auVar89._8_4_ = auVar60._8_4_ * 0.0;
    auVar89._12_4_ = auVar60._12_4_ * 0.0;
    auVar242 = vfmadd231ps_fma(auVar89,auVar61,auVar116);
    auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar13,auVar242);
    local_770._0_4_ = auVar12._0_4_ + auVar87._0_4_;
    local_770._4_4_ = auVar12._4_4_ + auVar87._4_4_;
    fStack_768 = auVar12._8_4_ + auVar87._8_4_;
    fStack_764 = auVar12._12_4_ + auVar87._12_4_;
    auVar265._8_4_ = 0x40400000;
    auVar265._0_8_ = 0x4040000040400000;
    auVar265._12_4_ = 0x40400000;
    auVar87 = vfmadd231ps_fma(auVar242,auVar13,auVar265);
    auVar88 = vfnmadd231ps_fma(auVar87,auVar12,auVar265);
    auVar239._0_4_ = auVar11._0_4_ * 0.0;
    auVar239._4_4_ = auVar11._4_4_ * 0.0;
    auVar239._8_4_ = auVar11._8_4_ * 0.0;
    auVar239._12_4_ = auVar11._12_4_ * 0.0;
    auVar242 = vfmadd231ps_fma(auVar239,auVar121,auVar116);
    auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar242);
    auVar254._0_4_ = auVar8._0_4_ + auVar87._0_4_;
    auVar254._4_4_ = auVar8._4_4_ + auVar87._4_4_;
    auVar254._8_4_ = auVar8._8_4_ + auVar87._8_4_;
    auVar254._12_4_ = auVar8._12_4_ + auVar87._12_4_;
    auVar87 = vfmadd231ps_fma(auVar242,auVar9,auVar265);
    auVar242 = vfnmadd231ps_fma(auVar87,auVar8,auVar265);
    auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar60);
    auVar87 = vfmadd231ps_fma(auVar87,auVar13,auVar116);
    auVar87 = vfmadd231ps_fma(auVar87,auVar12,auVar116);
    auVar131._0_4_ = auVar60._0_4_ * 3.0;
    auVar131._4_4_ = auVar60._4_4_ * 3.0;
    auVar131._8_4_ = auVar60._8_4_ * 3.0;
    auVar131._12_4_ = auVar60._12_4_ * 3.0;
    auVar61 = vfnmadd231ps_fma(auVar131,auVar265,auVar61);
    auVar13 = vfmadd231ps_fma(auVar61,auVar116,auVar13);
    auVar61 = vfnmadd231ps_fma(auVar13,auVar116,auVar12);
    auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar121,auVar11);
    auVar12 = vfmadd231ps_fma(auVar12,auVar9,auVar116);
    auVar12 = vfmadd231ps_fma(auVar12,auVar8,auVar116);
    auVar221._0_4_ = auVar11._0_4_ * 3.0;
    auVar221._4_4_ = auVar11._4_4_ * 3.0;
    auVar221._8_4_ = auVar11._8_4_ * 3.0;
    auVar221._12_4_ = auVar11._12_4_ * 3.0;
    auVar121 = vfnmadd231ps_fma(auVar221,auVar265,auVar121);
    auVar9 = vfmadd231ps_fma(auVar121,auVar116,auVar9);
    auVar13 = vfnmadd231ps_fma(auVar9,auVar116,auVar8);
    auVar8 = vshufps_avx(auVar88,auVar88,0xc9);
    auVar9 = vshufps_avx(auVar254,auVar254,0xc9);
    fVar115 = auVar88._0_4_;
    auVar155._0_4_ = fVar115 * auVar9._0_4_;
    fVar82 = auVar88._4_4_;
    auVar155._4_4_ = fVar82 * auVar9._4_4_;
    fVar59 = auVar88._8_4_;
    auVar155._8_4_ = fVar59 * auVar9._8_4_;
    fVar154 = auVar88._12_4_;
    auVar155._12_4_ = fVar154 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar155,auVar8,auVar254);
    auVar121 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar242,auVar242,0xc9);
    auVar156._0_4_ = fVar115 * auVar9._0_4_;
    auVar156._4_4_ = fVar82 * auVar9._4_4_;
    auVar156._8_4_ = fVar59 * auVar9._8_4_;
    auVar156._12_4_ = fVar154 * auVar9._12_4_;
    auVar8 = vfmsub231ps_fma(auVar156,auVar8,auVar242);
    auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar8 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
    fVar58 = auVar61._0_4_;
    auVar141._0_4_ = fVar58 * auVar9._0_4_;
    fVar219 = auVar61._4_4_;
    auVar141._4_4_ = fVar219 * auVar9._4_4_;
    fVar128 = auVar61._8_4_;
    auVar141._8_4_ = fVar128 * auVar9._8_4_;
    fVar138 = auVar61._12_4_;
    auVar141._12_4_ = fVar138 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar141,auVar8,auVar12);
    auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar176._0_4_ = fVar58 * auVar9._0_4_;
    auVar176._4_4_ = fVar219 * auVar9._4_4_;
    auVar176._8_4_ = fVar128 * auVar9._8_4_;
    auVar176._12_4_ = fVar138 * auVar9._12_4_;
    auVar9 = vfmsub231ps_fma(auVar176,auVar8,auVar13);
    auVar8 = vdpps_avx(auVar121,auVar121,0x7f);
    auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
    fVar81 = auVar8._0_4_;
    auVar222._4_12_ = ZEXT812(0) << 0x20;
    auVar222._0_4_ = fVar81;
    auVar9 = vrsqrtss_avx(auVar222,auVar222);
    fVar56 = auVar9._0_4_;
    auVar9 = vdpps_avx(auVar121,auVar11,0x7f);
    fVar83 = fVar56 * 1.5 - fVar81 * 0.5 * fVar56 * fVar56 * fVar56;
    fVar153 = auVar121._0_4_ * fVar83;
    fVar172 = auVar121._4_4_ * fVar83;
    fVar173 = auVar121._8_4_ * fVar83;
    fVar174 = auVar121._12_4_ * fVar83;
    auVar233._0_4_ = auVar11._0_4_ * fVar81;
    auVar233._4_4_ = auVar11._4_4_ * fVar81;
    auVar233._8_4_ = auVar11._8_4_ * fVar81;
    auVar233._12_4_ = auVar11._12_4_ * fVar81;
    fVar56 = auVar9._0_4_;
    auVar193._0_4_ = auVar121._0_4_ * fVar56;
    auVar193._4_4_ = auVar121._4_4_ * fVar56;
    auVar193._8_4_ = auVar121._8_4_ * fVar56;
    auVar193._12_4_ = auVar121._12_4_ * fVar56;
    auVar121 = vsubps_avx(auVar233,auVar193);
    auVar9 = vrcpss_avx(auVar222,auVar222);
    auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
    fVar56 = auVar9._0_4_ * auVar8._0_4_;
    auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
    fVar81 = auVar8._0_4_;
    auVar205._4_12_ = ZEXT812(0) << 0x20;
    auVar205._0_4_ = fVar81;
    auVar9 = vrsqrtss_avx(auVar205,auVar205);
    fVar84 = auVar9._0_4_;
    fVar84 = fVar84 * 1.5 - fVar81 * 0.5 * fVar84 * fVar84 * fVar84;
    fVar238 = fVar84 * auVar12._0_4_;
    fVar251 = fVar84 * auVar12._4_4_;
    fVar252 = fVar84 * auVar12._8_4_;
    fVar253 = fVar84 * auVar12._12_4_;
    auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
    auVar177._0_4_ = fVar81 * auVar13._0_4_;
    auVar177._4_4_ = fVar81 * auVar13._4_4_;
    auVar177._8_4_ = fVar81 * auVar13._8_4_;
    auVar177._12_4_ = fVar81 * auVar13._12_4_;
    fVar81 = auVar9._0_4_;
    auVar142._0_4_ = fVar81 * auVar12._0_4_;
    auVar142._4_4_ = fVar81 * auVar12._4_4_;
    auVar142._8_4_ = fVar81 * auVar12._8_4_;
    auVar142._12_4_ = fVar81 * auVar12._12_4_;
    auVar11 = vsubps_avx(auVar177,auVar142);
    auVar9 = vrcpss_avx(auVar205,auVar205);
    auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
    fVar81 = auVar8._0_4_ * auVar9._0_4_;
    auVar8 = vshufps_avx(_local_770,_local_770,0xff);
    auVar206._0_4_ = auVar8._0_4_ * fVar153;
    auVar206._4_4_ = auVar8._4_4_ * fVar172;
    auVar206._8_4_ = auVar8._8_4_ * fVar173;
    auVar206._12_4_ = auVar8._12_4_ * fVar174;
    local_540 = vsubps_avx(_local_770,auVar206);
    auVar9 = vshufps_avx(auVar88,auVar88,0xff);
    auVar157._0_4_ = auVar9._0_4_ * fVar153 + fVar83 * auVar121._0_4_ * fVar56 * auVar8._0_4_;
    auVar157._4_4_ = auVar9._4_4_ * fVar172 + fVar83 * auVar121._4_4_ * fVar56 * auVar8._4_4_;
    auVar157._8_4_ = auVar9._8_4_ * fVar173 + fVar83 * auVar121._8_4_ * fVar56 * auVar8._8_4_;
    auVar157._12_4_ = auVar9._12_4_ * fVar174 + fVar83 * auVar121._12_4_ * fVar56 * auVar8._12_4_;
    auVar121 = vsubps_avx(auVar88,auVar157);
    local_550._0_4_ = auVar206._0_4_ + (float)local_770._0_4_;
    local_550._4_4_ = auVar206._4_4_ + (float)local_770._4_4_;
    fStack_548 = auVar206._8_4_ + fStack_768;
    fStack_544 = auVar206._12_4_ + fStack_764;
    auVar8 = vshufps_avx(auVar87,auVar87,0xff);
    auVar107._0_4_ = fVar238 * auVar8._0_4_;
    auVar107._4_4_ = fVar251 * auVar8._4_4_;
    auVar107._8_4_ = fVar252 * auVar8._8_4_;
    auVar107._12_4_ = fVar253 * auVar8._12_4_;
    local_560 = vsubps_avx(auVar87,auVar107);
    auVar9 = vshufps_avx(auVar61,auVar61,0xff);
    auVar90._0_4_ = fVar238 * auVar9._0_4_ + auVar8._0_4_ * fVar84 * auVar11._0_4_ * fVar81;
    auVar90._4_4_ = fVar251 * auVar9._4_4_ + auVar8._4_4_ * fVar84 * auVar11._4_4_ * fVar81;
    auVar90._8_4_ = fVar252 * auVar9._8_4_ + auVar8._8_4_ * fVar84 * auVar11._8_4_ * fVar81;
    auVar90._12_4_ = fVar253 * auVar9._12_4_ + auVar8._12_4_ * fVar84 * auVar11._12_4_ * fVar81;
    auVar8 = vsubps_avx(auVar61,auVar90);
    fVar153 = auVar87._0_4_ + auVar107._0_4_;
    fVar172 = auVar87._4_4_ + auVar107._4_4_;
    fVar173 = auVar87._8_4_ + auVar107._8_4_;
    fVar174 = auVar87._12_4_ + auVar107._12_4_;
    local_570._0_4_ = local_540._0_4_ + auVar121._0_4_ * 0.33333334;
    local_570._4_4_ = local_540._4_4_ + auVar121._4_4_ * 0.33333334;
    local_570._8_4_ = local_540._8_4_ + auVar121._8_4_ * 0.33333334;
    local_570._12_4_ = local_540._12_4_ + auVar121._12_4_ * 0.33333334;
    auVar91._0_4_ = auVar8._0_4_ * 0.33333334;
    auVar91._4_4_ = auVar8._4_4_ * 0.33333334;
    auVar91._8_4_ = auVar8._8_4_ * 0.33333334;
    auVar91._12_4_ = auVar8._12_4_ * 0.33333334;
    local_580 = vsubps_avx(local_560,auVar91);
    local_520 = vsubps_avx(local_540,auVar106);
    auVar8 = vshufps_avx(local_520,local_520,0x55);
    auVar9 = vshufps_avx(local_520,local_520,0xaa);
    aVar1 = pre->ray_space[k].vy.field_0;
    fVar56 = pre->ray_space[k].vz.field_0.m128[0];
    fVar81 = pre->ray_space[k].vz.field_0.m128[1];
    fVar83 = pre->ray_space[k].vz.field_0.m128[2];
    fVar84 = pre->ray_space[k].vz.field_0.m128[3];
    auVar92._0_4_ = fVar56 * auVar9._0_4_;
    auVar92._4_4_ = fVar81 * auVar9._4_4_;
    auVar92._8_4_ = fVar83 * auVar9._8_4_;
    auVar92._12_4_ = fVar84 * auVar9._12_4_;
    auVar121 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar1,auVar8);
    local_530 = vsubps_avx(local_570,auVar106);
    auVar8 = vshufps_avx(local_530,local_530,0x55);
    auVar9 = vshufps_avx(local_530,local_530,0xaa);
    auVar271._0_4_ = fVar56 * auVar9._0_4_;
    auVar271._4_4_ = fVar81 * auVar9._4_4_;
    auVar271._8_4_ = fVar83 * auVar9._8_4_;
    auVar271._12_4_ = fVar84 * auVar9._12_4_;
    auVar9 = vfmadd231ps_fma(auVar271,(undefined1  [16])aVar1,auVar8);
    local_3e0 = vsubps_avx(local_580,auVar106);
    auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar240._0_4_ = fVar56 * auVar8._0_4_;
    auVar240._4_4_ = fVar81 * auVar8._4_4_;
    auVar240._8_4_ = fVar83 * auVar8._8_4_;
    auVar240._12_4_ = fVar84 * auVar8._12_4_;
    auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar11 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar1,auVar8);
    local_3f0 = vsubps_avx(local_560,auVar106);
    auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar255._0_4_ = fVar56 * auVar8._0_4_;
    auVar255._4_4_ = fVar81 * auVar8._4_4_;
    auVar255._8_4_ = fVar83 * auVar8._8_4_;
    auVar255._12_4_ = fVar84 * auVar8._12_4_;
    auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar12 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar1,auVar8);
    local_400 = vsubps_avx(_local_550,auVar106);
    auVar8 = vshufps_avx(local_400,local_400,0xaa);
    auVar143._0_4_ = fVar56 * auVar8._0_4_;
    auVar143._4_4_ = fVar81 * auVar8._4_4_;
    auVar143._8_4_ = fVar83 * auVar8._8_4_;
    auVar143._12_4_ = fVar84 * auVar8._12_4_;
    auVar8 = vshufps_avx(local_400,local_400,0x55);
    auVar13 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar1,auVar8);
    local_590._0_4_ = (fVar115 + auVar157._0_4_) * 0.33333334 + (float)local_550._0_4_;
    local_590._4_4_ = (fVar82 + auVar157._4_4_) * 0.33333334 + (float)local_550._4_4_;
    fStack_588 = (fVar59 + auVar157._8_4_) * 0.33333334 + fStack_548;
    fStack_584 = (fVar154 + auVar157._12_4_) * 0.33333334 + fStack_544;
    local_410 = vsubps_avx(_local_590,auVar106);
    auVar8 = vshufps_avx(local_410,local_410,0xaa);
    auVar194._0_4_ = auVar8._0_4_ * fVar56;
    auVar194._4_4_ = auVar8._4_4_ * fVar81;
    auVar194._8_4_ = auVar8._8_4_ * fVar83;
    auVar194._12_4_ = auVar8._12_4_ * fVar84;
    auVar8 = vshufps_avx(local_410,local_410,0x55);
    auVar61 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar1,auVar8);
    auVar207._0_4_ = (fVar58 + auVar90._0_4_) * 0.33333334;
    auVar207._4_4_ = (fVar219 + auVar90._4_4_) * 0.33333334;
    auVar207._8_4_ = (fVar128 + auVar90._8_4_) * 0.33333334;
    auVar207._12_4_ = (fVar138 + auVar90._12_4_) * 0.33333334;
    auVar42._4_4_ = fVar172;
    auVar42._0_4_ = fVar153;
    auVar42._8_4_ = fVar173;
    auVar42._12_4_ = fVar174;
    _local_5a0 = vsubps_avx(auVar42,auVar207);
    local_420 = vsubps_avx(_local_5a0,auVar106);
    auVar8 = vshufps_avx(local_420,local_420,0xaa);
    auVar208._0_4_ = auVar8._0_4_ * fVar56;
    auVar208._4_4_ = auVar8._4_4_ * fVar81;
    auVar208._8_4_ = auVar8._8_4_ * fVar83;
    auVar208._12_4_ = auVar8._12_4_ * fVar84;
    auVar8 = vshufps_avx(local_420,local_420,0x55);
    auVar60 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar1,auVar8);
    local_430 = vsubps_avx(auVar42,auVar106);
    auVar8 = vshufps_avx(local_430,local_430,0xaa);
    auVar62._0_4_ = fVar56 * auVar8._0_4_;
    auVar62._4_4_ = fVar81 * auVar8._4_4_;
    auVar62._8_4_ = fVar83 * auVar8._8_4_;
    auVar62._12_4_ = fVar84 * auVar8._12_4_;
    auVar8 = vshufps_avx(local_430,local_430,0x55);
    auVar8 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar8);
    auVar158._4_4_ = local_520._0_4_;
    auVar158._0_4_ = local_520._0_4_;
    auVar158._8_4_ = local_520._0_4_;
    auVar158._12_4_ = local_520._0_4_;
    aVar1 = pre->ray_space[k].vx.field_0;
    auVar106 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar1,auVar158);
    auVar159._4_4_ = local_530._0_4_;
    auVar159._0_4_ = local_530._0_4_;
    auVar159._8_4_ = local_530._0_4_;
    auVar159._12_4_ = local_530._0_4_;
    auVar87 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar159);
    uVar57 = local_3e0._0_4_;
    auVar160._4_4_ = uVar57;
    auVar160._0_4_ = uVar57;
    auVar160._8_4_ = uVar57;
    auVar160._12_4_ = uVar57;
    auVar242 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar160);
    uVar57 = local_3f0._0_4_;
    auVar161._4_4_ = uVar57;
    auVar161._0_4_ = uVar57;
    auVar161._8_4_ = uVar57;
    auVar161._12_4_ = uVar57;
    auVar88 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar161);
    uVar57 = local_400._0_4_;
    auVar162._4_4_ = uVar57;
    auVar162._0_4_ = uVar57;
    auVar162._8_4_ = uVar57;
    auVar162._12_4_ = uVar57;
    auVar13 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar1,auVar162);
    uVar57 = local_410._0_4_;
    auVar163._4_4_ = uVar57;
    auVar163._0_4_ = uVar57;
    auVar163._8_4_ = uVar57;
    auVar163._12_4_ = uVar57;
    auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar163);
    uVar57 = local_420._0_4_;
    auVar164._4_4_ = uVar57;
    auVar164._0_4_ = uVar57;
    auVar164._8_4_ = uVar57;
    auVar164._12_4_ = uVar57;
    auVar60 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar1,auVar164);
    uVar57 = local_430._0_4_;
    auVar165._4_4_ = uVar57;
    auVar165._0_4_ = uVar57;
    auVar165._8_4_ = uVar57;
    auVar165._12_4_ = uVar57;
    auVar116 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar165);
    local_500 = vmovlhps_avx(auVar106,auVar13);
    auVar11 = vmovlhps_avx(auVar87,auVar61);
    auVar12 = vmovlhps_avx(auVar242,auVar60);
    _local_390 = vmovlhps_avx(auVar88,auVar116);
    auVar8 = vminps_avx(local_500,auVar11);
    auVar9 = vminps_avx(auVar12,_local_390);
    auVar121 = vminps_avx(auVar8,auVar9);
    auVar8 = vmaxps_avx(local_500,auVar11);
    auVar9 = vmaxps_avx(auVar12,_local_390);
    auVar8 = vmaxps_avx(auVar8,auVar9);
    auVar9 = vshufpd_avx(auVar121,auVar121,3);
    auVar121 = vminps_avx(auVar121,auVar9);
    auVar9 = vshufpd_avx(auVar8,auVar8,3);
    auVar9 = vmaxps_avx(auVar8,auVar9);
    auVar8 = vandps_avx(local_510,auVar121);
    auVar9 = vandps_avx(local_510,auVar9);
    auVar8 = vmaxps_avx(auVar8,auVar9);
    auVar9 = vmovshdup_avx(auVar8);
    auVar8 = vmaxss_avx(auVar9,auVar8);
    local_1c0 = auVar8._0_4_ * 9.536743e-07;
    auVar178._8_8_ = auVar106._0_8_;
    auVar178._0_8_ = auVar106._0_8_;
    auVar223._8_8_ = auVar87._0_8_;
    auVar223._0_8_ = auVar87._0_8_;
    auVar241._0_8_ = auVar242._0_8_;
    auVar241._8_8_ = auVar241._0_8_;
    auVar256._0_8_ = auVar88._0_8_;
    auVar256._8_8_ = auVar256._0_8_;
    local_3a0 = ZEXT416((uint)local_1c0);
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    local_1e0 = -local_1c0;
    fStack_1dc = local_1e0;
    fStack_1d8 = local_1e0;
    fStack_1d4 = local_1e0;
    fStack_1d0 = local_1e0;
    fStack_1cc = local_1e0;
    fStack_1c8 = local_1e0;
    fStack_1c4 = local_1e0;
    local_320 = uVar46;
    uStack_31c = uVar46;
    uStack_318 = uVar46;
    uStack_314 = uVar46;
    uStack_310 = uVar46;
    uStack_30c = uVar46;
    uStack_308 = uVar46;
    uStack_304 = uVar46;
    local_340 = uVar3;
    uStack_33c = uVar3;
    uStack_338 = uVar3;
    uStack_334 = uVar3;
    uStack_330 = uVar3;
    uStack_32c = uVar3;
    uStack_328 = uVar3;
    uStack_324 = uVar3;
    uVar55 = 0;
    fVar56 = *(float *)(ray + k * 4 + 0x60);
    local_3b0 = vsubps_avx(auVar11,local_500);
    local_3c0 = vsubps_avx(auVar12,auVar11);
    local_3d0 = vsubps_avx(_local_390,auVar12);
    local_450 = vsubps_avx(_local_550,local_540);
    local_460 = vsubps_avx(_local_590,local_570);
    local_470 = vsubps_avx(_local_5a0,local_580);
    auVar43._4_4_ = fVar172;
    auVar43._0_4_ = fVar153;
    auVar43._8_4_ = fVar173;
    auVar43._12_4_ = fVar174;
    _local_480 = vsubps_avx(auVar43,local_560);
    auVar63 = ZEXT816(0x3f80000000000000);
    local_440 = auVar63;
LAB_015abb4f:
    auVar8 = vshufps_avx(auVar63,auVar63,0x50);
    auVar272._8_4_ = 0x3f800000;
    auVar272._0_8_ = 0x3f8000003f800000;
    auVar272._12_4_ = 0x3f800000;
    auVar275._16_4_ = 0x3f800000;
    auVar275._0_16_ = auVar272;
    auVar275._20_4_ = 0x3f800000;
    auVar275._24_4_ = 0x3f800000;
    auVar275._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar272,auVar8);
    fVar81 = auVar8._0_4_;
    fVar128 = auVar13._0_4_;
    auVar64._0_4_ = fVar128 * fVar81;
    fVar83 = auVar8._4_4_;
    fVar138 = auVar13._4_4_;
    auVar64._4_4_ = fVar138 * fVar83;
    fVar84 = auVar8._8_4_;
    auVar64._8_4_ = fVar128 * fVar84;
    fVar115 = auVar8._12_4_;
    auVar64._12_4_ = fVar138 * fVar115;
    fVar238 = auVar61._0_4_;
    auVar166._0_4_ = fVar238 * fVar81;
    fVar251 = auVar61._4_4_;
    auVar166._4_4_ = fVar251 * fVar83;
    auVar166._8_4_ = fVar238 * fVar84;
    auVar166._12_4_ = fVar251 * fVar115;
    fVar190 = auVar60._0_4_;
    auVar132._0_4_ = fVar190 * fVar81;
    fVar202 = auVar60._4_4_;
    auVar132._4_4_ = fVar202 * fVar83;
    auVar132._8_4_ = fVar190 * fVar84;
    auVar132._12_4_ = fVar202 * fVar115;
    fVar203 = auVar116._0_4_;
    auVar108._0_4_ = fVar203 * fVar81;
    fVar218 = auVar116._4_4_;
    auVar108._4_4_ = fVar218 * fVar83;
    auVar108._8_4_ = fVar203 * fVar84;
    auVar108._12_4_ = fVar218 * fVar115;
    auVar87 = vfmadd231ps_fma(auVar64,auVar9,auVar178);
    auVar242 = vfmadd231ps_fma(auVar166,auVar9,auVar223);
    auVar88 = vfmadd231ps_fma(auVar132,auVar9,auVar241);
    auVar130 = vfmadd231ps_fma(auVar108,auVar256,auVar9);
    auVar8 = vmovshdup_avx(local_440);
    fVar81 = local_440._0_4_;
    fStack_288 = (auVar8._0_4_ - fVar81) * 0.04761905;
    auVar216._4_4_ = fVar81;
    auVar216._0_4_ = fVar81;
    auVar216._8_4_ = fVar81;
    auVar216._12_4_ = fVar81;
    auVar216._16_4_ = fVar81;
    auVar216._20_4_ = fVar81;
    auVar216._24_4_ = fVar81;
    auVar216._28_4_ = fVar81;
    auVar102._0_8_ = auVar8._0_8_;
    auVar102._8_8_ = auVar102._0_8_;
    auVar102._16_8_ = auVar102._0_8_;
    auVar102._24_8_ = auVar102._0_8_;
    auVar76 = vsubps_avx(auVar102,auVar216);
    uVar57 = auVar87._0_4_;
    auVar269._4_4_ = uVar57;
    auVar269._0_4_ = uVar57;
    auVar269._8_4_ = uVar57;
    auVar269._12_4_ = uVar57;
    auVar269._16_4_ = uVar57;
    auVar269._20_4_ = uVar57;
    auVar269._24_4_ = uVar57;
    auVar269._28_4_ = uVar57;
    auVar8 = vmovshdup_avx(auVar87);
    uVar85 = auVar8._0_8_;
    auVar262._8_8_ = uVar85;
    auVar262._0_8_ = uVar85;
    auVar262._16_8_ = uVar85;
    auVar262._24_8_ = uVar85;
    fVar219 = auVar242._0_4_;
    auVar248._4_4_ = fVar219;
    auVar248._0_4_ = fVar219;
    auVar248._8_4_ = fVar219;
    auVar248._12_4_ = fVar219;
    auVar248._16_4_ = fVar219;
    auVar248._20_4_ = fVar219;
    auVar248._24_4_ = fVar219;
    auVar248._28_4_ = fVar219;
    auVar9 = vmovshdup_avx(auVar242);
    auVar103._0_8_ = auVar9._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    fVar58 = auVar88._0_4_;
    auVar182._4_4_ = fVar58;
    auVar182._0_4_ = fVar58;
    auVar182._8_4_ = fVar58;
    auVar182._12_4_ = fVar58;
    auVar182._16_4_ = fVar58;
    auVar182._20_4_ = fVar58;
    auVar182._24_4_ = fVar58;
    auVar182._28_4_ = fVar58;
    auVar121 = vmovshdup_avx(auVar88);
    auVar200._0_8_ = auVar121._0_8_;
    auVar200._8_8_ = auVar200._0_8_;
    auVar200._16_8_ = auVar200._0_8_;
    auVar200._24_8_ = auVar200._0_8_;
    fVar154 = auVar130._0_4_;
    auVar106 = vmovshdup_avx(auVar130);
    auVar234 = vfmadd132ps_fma(auVar76,auVar216,_DAT_01faff20);
    auVar76 = vsubps_avx(auVar275,ZEXT1632(auVar234));
    fVar81 = auVar234._0_4_;
    fVar83 = auVar234._4_4_;
    auVar15._4_4_ = fVar219 * fVar83;
    auVar15._0_4_ = fVar219 * fVar81;
    fVar84 = auVar234._8_4_;
    auVar15._8_4_ = fVar219 * fVar84;
    fVar115 = auVar234._12_4_;
    auVar15._12_4_ = fVar219 * fVar115;
    auVar15._16_4_ = fVar219 * 0.0;
    auVar15._20_4_ = fVar219 * 0.0;
    auVar15._24_4_ = fVar219 * 0.0;
    auVar15._28_4_ = 0x3f800000;
    auVar234 = vfmadd231ps_fma(auVar15,auVar76,auVar269);
    fVar82 = auVar9._0_4_;
    fVar59 = auVar9._4_4_;
    auVar14._4_4_ = fVar59 * fVar83;
    auVar14._0_4_ = fVar82 * fVar81;
    auVar14._8_4_ = fVar82 * fVar84;
    auVar14._12_4_ = fVar59 * fVar115;
    auVar14._16_4_ = fVar82 * 0.0;
    auVar14._20_4_ = fVar59 * 0.0;
    auVar14._24_4_ = fVar82 * 0.0;
    auVar14._28_4_ = uVar57;
    auVar86 = vfmadd231ps_fma(auVar14,auVar76,auVar262);
    auVar10._4_4_ = fVar58 * fVar83;
    auVar10._0_4_ = fVar58 * fVar81;
    auVar10._8_4_ = fVar58 * fVar84;
    auVar10._12_4_ = fVar58 * fVar115;
    auVar10._16_4_ = fVar58 * 0.0;
    auVar10._20_4_ = fVar58 * 0.0;
    auVar10._24_4_ = fVar58 * 0.0;
    auVar10._28_4_ = auVar8._4_4_;
    auVar129 = vfmadd231ps_fma(auVar10,auVar76,auVar248);
    fVar82 = auVar121._0_4_;
    fVar59 = auVar121._4_4_;
    auVar16._4_4_ = fVar59 * fVar83;
    auVar16._0_4_ = fVar82 * fVar81;
    auVar16._8_4_ = fVar82 * fVar84;
    auVar16._12_4_ = fVar59 * fVar115;
    auVar16._16_4_ = fVar82 * 0.0;
    auVar16._20_4_ = fVar59 * 0.0;
    auVar16._24_4_ = fVar82 * 0.0;
    auVar16._28_4_ = fVar219;
    auVar118 = vfmadd231ps_fma(auVar16,auVar76,auVar103);
    auVar8 = vshufps_avx(auVar87,auVar87,0xaa);
    local_700._8_8_ = auVar8._0_8_;
    local_700._0_8_ = local_700._8_8_;
    local_700._16_8_ = local_700._8_8_;
    local_700._24_8_ = local_700._8_8_;
    auVar9 = vshufps_avx(auVar87,auVar87,0xff);
    uStack_758 = auVar9._0_8_;
    local_760 = (undefined1  [8])uStack_758;
    uStack_750 = uStack_758;
    uStack_748 = uStack_758;
    auVar17._4_4_ = fVar154 * fVar83;
    auVar17._0_4_ = fVar154 * fVar81;
    auVar17._8_4_ = fVar154 * fVar84;
    auVar17._12_4_ = fVar154 * fVar115;
    auVar17._16_4_ = fVar154 * 0.0;
    auVar17._20_4_ = fVar154 * 0.0;
    auVar17._24_4_ = fVar154 * 0.0;
    auVar17._28_4_ = fVar154;
    auVar87 = vfmadd231ps_fma(auVar17,auVar76,auVar182);
    auVar9 = vshufps_avx(auVar242,auVar242,0xaa);
    auVar183._0_8_ = auVar9._0_8_;
    auVar183._8_8_ = auVar183._0_8_;
    auVar183._16_8_ = auVar183._0_8_;
    auVar183._24_8_ = auVar183._0_8_;
    auVar121 = vshufps_avx(auVar242,auVar242,0xff);
    local_620._8_8_ = auVar121._0_8_;
    local_620._0_8_ = local_620._8_8_;
    local_620._16_8_ = local_620._8_8_;
    local_620._24_8_ = local_620._8_8_;
    fVar82 = auVar106._0_4_;
    fVar59 = auVar106._4_4_;
    auVar18._4_4_ = fVar59 * fVar83;
    auVar18._0_4_ = fVar82 * fVar81;
    auVar18._8_4_ = fVar82 * fVar84;
    auVar18._12_4_ = fVar59 * fVar115;
    auVar18._16_4_ = fVar82 * 0.0;
    auVar18._20_4_ = fVar59 * 0.0;
    auVar18._24_4_ = fVar82 * 0.0;
    auVar18._28_4_ = auVar8._4_4_;
    auVar139 = vfmadd231ps_fma(auVar18,auVar76,auVar200);
    auVar250._28_4_ = fVar59;
    auVar250._0_28_ =
         ZEXT1628(CONCAT412(auVar129._12_4_ * fVar115,
                            CONCAT48(auVar129._8_4_ * fVar84,
                                     CONCAT44(auVar129._4_4_ * fVar83,auVar129._0_4_ * fVar81))));
    auVar234 = vfmadd231ps_fma(auVar250,auVar76,ZEXT1632(auVar234));
    fVar82 = auVar121._4_4_;
    auVar19._28_4_ = fVar82;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar115,
                            CONCAT48(auVar118._8_4_ * fVar84,
                                     CONCAT44(auVar118._4_4_ * fVar83,auVar118._0_4_ * fVar81))));
    auVar86 = vfmadd231ps_fma(auVar19,auVar76,ZEXT1632(auVar86));
    auVar8 = vshufps_avx(auVar88,auVar88,0xaa);
    uVar85 = auVar8._0_8_;
    auVar171._8_8_ = uVar85;
    auVar171._0_8_ = uVar85;
    auVar171._16_8_ = uVar85;
    auVar171._24_8_ = uVar85;
    auVar106 = vshufps_avx(auVar88,auVar88,0xff);
    uVar85 = auVar106._0_8_;
    auVar276._8_8_ = uVar85;
    auVar276._0_8_ = uVar85;
    auVar276._16_8_ = uVar85;
    auVar276._24_8_ = uVar85;
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar115,
                                                 CONCAT48(auVar87._8_4_ * fVar84,
                                                          CONCAT44(auVar87._4_4_ * fVar83,
                                                                   auVar87._0_4_ * fVar81)))),
                              auVar76,ZEXT1632(auVar129));
    auVar87 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar242 = vshufps_avx(auVar130,auVar130,0xff);
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar139._12_4_,
                                                  CONCAT48(fVar84 * auVar139._8_4_,
                                                           CONCAT44(fVar83 * auVar139._4_4_,
                                                                    fVar81 * auVar139._0_4_)))),
                               auVar76,ZEXT1632(auVar118));
    auVar129 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar88._12_4_,
                                                  CONCAT48(fVar84 * auVar88._8_4_,
                                                           CONCAT44(fVar83 * auVar88._4_4_,
                                                                    fVar81 * auVar88._0_4_)))),
                               auVar76,ZEXT1632(auVar234));
    auVar15 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar234));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar130._12_4_,
                                                 CONCAT48(fVar84 * auVar130._8_4_,
                                                          CONCAT44(fVar83 * auVar130._4_4_,
                                                                   fVar81 * auVar130._0_4_)))),
                              auVar76,ZEXT1632(auVar86));
    auVar77 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar86));
    fVar59 = auVar77._28_4_;
    auVar249._0_4_ = fStack_288 * auVar15._0_4_ * 3.0;
    auVar249._4_4_ = fStack_288 * auVar15._4_4_ * 3.0;
    auVar249._8_4_ = fStack_288 * auVar15._8_4_ * 3.0;
    auVar249._12_4_ = fStack_288 * auVar15._12_4_ * 3.0;
    auVar249._16_4_ = fStack_288 * auVar15._16_4_ * 3.0;
    auVar249._20_4_ = fStack_288 * auVar15._20_4_ * 3.0;
    auVar249._24_4_ = fStack_288 * auVar15._24_4_ * 3.0;
    auVar249._28_4_ = 0;
    local_5c0._0_4_ = fStack_288 * auVar77._0_4_ * 3.0;
    local_5c0._4_4_ = fStack_288 * auVar77._4_4_ * 3.0;
    fStack_5b8 = fStack_288 * auVar77._8_4_ * 3.0;
    fStack_5b4 = fStack_288 * auVar77._12_4_ * 3.0;
    fStack_5b0 = fStack_288 * auVar77._16_4_ * 3.0;
    fStack_5ac = fStack_288 * auVar77._20_4_ * 3.0;
    fStack_5a8 = fStack_288 * auVar77._24_4_ * 3.0;
    fStack_5a4 = fVar59;
    fVar154 = auVar9._0_4_;
    fVar58 = auVar9._4_4_;
    auVar20._4_4_ = fVar58 * fVar83;
    auVar20._0_4_ = fVar154 * fVar81;
    auVar20._8_4_ = fVar154 * fVar84;
    auVar20._12_4_ = fVar58 * fVar115;
    auVar20._16_4_ = fVar154 * 0.0;
    auVar20._20_4_ = fVar58 * 0.0;
    auVar20._24_4_ = fVar154 * 0.0;
    auVar20._28_4_ = fVar59;
    auVar9 = vfmadd231ps_fma(auVar20,auVar76,local_700);
    fVar154 = auVar121._0_4_;
    auVar21._4_4_ = fVar82 * fVar83;
    auVar21._0_4_ = fVar154 * fVar81;
    auVar21._8_4_ = fVar154 * fVar84;
    auVar21._12_4_ = fVar82 * fVar115;
    auVar21._16_4_ = fVar154 * 0.0;
    auVar21._20_4_ = fVar82 * 0.0;
    auVar21._24_4_ = fVar154 * 0.0;
    auVar21._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar21,auVar76,_local_760);
    fVar82 = auVar8._0_4_;
    fVar154 = auVar8._4_4_;
    auVar22._4_4_ = fVar154 * fVar83;
    auVar22._0_4_ = fVar82 * fVar81;
    auVar22._8_4_ = fVar82 * fVar84;
    auVar22._12_4_ = fVar154 * fVar115;
    auVar22._16_4_ = fVar82 * 0.0;
    auVar22._20_4_ = fVar154 * 0.0;
    auVar22._24_4_ = fVar82 * 0.0;
    auVar22._28_4_ = auVar15._28_4_;
    auVar8 = vfmadd231ps_fma(auVar22,auVar76,auVar183);
    fVar82 = auVar106._0_4_;
    fVar219 = auVar106._4_4_;
    auVar23._4_4_ = fVar219 * fVar83;
    auVar23._0_4_ = fVar82 * fVar81;
    auVar23._8_4_ = fVar82 * fVar84;
    auVar23._12_4_ = fVar219 * fVar115;
    auVar23._16_4_ = fVar82 * 0.0;
    auVar23._20_4_ = fVar219 * 0.0;
    auVar23._24_4_ = fVar82 * 0.0;
    auVar23._28_4_ = fVar58;
    auVar106 = vfmadd231ps_fma(auVar23,auVar76,local_620);
    auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar129));
    fVar82 = auVar87._0_4_;
    fVar154 = auVar87._4_4_;
    auVar24._4_4_ = fVar154 * fVar83;
    auVar24._0_4_ = fVar82 * fVar81;
    auVar24._8_4_ = fVar82 * fVar84;
    auVar24._12_4_ = fVar154 * fVar115;
    auVar24._16_4_ = fVar82 * 0.0;
    auVar24._20_4_ = fVar154 * 0.0;
    auVar24._24_4_ = fVar82 * 0.0;
    auVar24._28_4_ = fVar154;
    auVar87 = vfmadd231ps_fma(auVar24,auVar76,auVar171);
    auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar88));
    fVar82 = auVar242._0_4_;
    fVar154 = auVar242._4_4_;
    auVar25._4_4_ = fVar154 * fVar83;
    auVar25._0_4_ = fVar82 * fVar81;
    auVar25._8_4_ = fVar82 * fVar84;
    auVar25._12_4_ = fVar154 * fVar115;
    auVar25._16_4_ = fVar82 * 0.0;
    auVar25._20_4_ = fVar154 * 0.0;
    auVar25._24_4_ = fVar82 * 0.0;
    auVar25._28_4_ = fVar154;
    auVar242 = vfmadd231ps_fma(auVar25,auVar76,auVar276);
    auVar26._28_4_ = fVar219;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar8._12_4_ * fVar115,
                            CONCAT48(auVar8._8_4_ * fVar84,
                                     CONCAT44(auVar8._4_4_ * fVar83,auVar8._0_4_ * fVar81))));
    auVar9 = vfmadd231ps_fma(auVar26,auVar76,ZEXT1632(auVar9));
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar106._12_4_,
                                                  CONCAT48(fVar84 * auVar106._8_4_,
                                                           CONCAT44(fVar83 * auVar106._4_4_,
                                                                    fVar81 * auVar106._0_4_)))),
                               auVar76,ZEXT1632(auVar121));
    auVar104._0_4_ = auVar129._0_4_ + auVar249._0_4_;
    auVar104._4_4_ = auVar129._4_4_ + auVar249._4_4_;
    auVar104._8_4_ = auVar129._8_4_ + auVar249._8_4_;
    auVar104._12_4_ = auVar129._12_4_ + auVar249._12_4_;
    auVar104._16_4_ = auVar249._16_4_ + 0.0;
    auVar104._20_4_ = auVar249._20_4_ + 0.0;
    auVar104._24_4_ = auVar249._24_4_ + 0.0;
    auVar104._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar87._12_4_ * fVar115,
                                                CONCAT48(auVar87._8_4_ * fVar84,
                                                         CONCAT44(auVar87._4_4_ * fVar83,
                                                                  auVar87._0_4_ * fVar81)))),auVar76
                             ,ZEXT1632(auVar8));
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar242._12_4_ * fVar115,
                                                  CONCAT48(auVar242._8_4_ * fVar84,
                                                           CONCAT44(auVar242._4_4_ * fVar83,
                                                                    auVar242._0_4_ * fVar81)))),
                               auVar76,ZEXT1632(auVar106));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar8._12_4_,
                                                 CONCAT48(fVar84 * auVar8._8_4_,
                                                          CONCAT44(fVar83 * auVar8._4_4_,
                                                                   fVar81 * auVar8._0_4_)))),auVar76
                              ,ZEXT1632(auVar9));
    auVar242 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar106._12_4_ * fVar115,
                                                  CONCAT48(auVar106._8_4_ * fVar84,
                                                           CONCAT44(auVar106._4_4_ * fVar83,
                                                                    auVar106._0_4_ * fVar81)))),
                               ZEXT1632(auVar121),auVar76);
    auVar76 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar15 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar121));
    auVar270._0_4_ = fStack_288 * auVar76._0_4_ * 3.0;
    auVar270._4_4_ = fStack_288 * auVar76._4_4_ * 3.0;
    auVar270._8_4_ = fStack_288 * auVar76._8_4_ * 3.0;
    auVar270._12_4_ = fStack_288 * auVar76._12_4_ * 3.0;
    auVar270._16_4_ = fStack_288 * auVar76._16_4_ * 3.0;
    auVar270._20_4_ = fStack_288 * auVar76._20_4_ * 3.0;
    auVar270._24_4_ = fStack_288 * auVar76._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    local_2a0 = fStack_288 * auVar15._0_4_ * 3.0;
    fStack_29c = fStack_288 * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fStack_29c;
    auVar27._0_4_ = local_2a0;
    fStack_298 = fStack_288 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fStack_298;
    fStack_294 = fStack_288 * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fStack_294;
    fStack_290 = fStack_288 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = fStack_290;
    fStack_28c = fStack_288 * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fStack_28c;
    fStack_288 = fStack_288 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fStack_288;
    auVar27._28_4_ = 0x40400000;
    auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar87));
    local_4e0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar242));
    auVar76 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar129));
    auVar15 = vsubps_avx(ZEXT1632(auVar242),ZEXT1632(auVar88));
    auVar77 = vsubps_avx(auVar18,auVar16);
    fVar252 = auVar76._0_4_ + auVar77._0_4_;
    fVar253 = auVar76._4_4_ + auVar77._4_4_;
    fVar185 = auVar76._8_4_ + auVar77._8_4_;
    fVar186 = auVar76._12_4_ + auVar77._12_4_;
    fVar187 = auVar76._16_4_ + auVar77._16_4_;
    fVar188 = auVar76._20_4_ + auVar77._20_4_;
    fVar189 = auVar76._24_4_ + auVar77._24_4_;
    auVar14 = vsubps_avx(local_4e0,auVar17);
    auVar78._0_4_ = auVar15._0_4_ + auVar14._0_4_;
    auVar78._4_4_ = auVar15._4_4_ + auVar14._4_4_;
    auVar78._8_4_ = auVar15._8_4_ + auVar14._8_4_;
    auVar78._12_4_ = auVar15._12_4_ + auVar14._12_4_;
    auVar78._16_4_ = auVar15._16_4_ + auVar14._16_4_;
    auVar78._20_4_ = auVar15._20_4_ + auVar14._20_4_;
    auVar78._24_4_ = auVar15._24_4_ + auVar14._24_4_;
    auVar78._28_4_ = auVar15._28_4_ + auVar14._28_4_;
    local_240 = ZEXT1632(auVar88);
    fVar81 = auVar88._0_4_;
    local_2c0 = (float)local_5c0._0_4_ + fVar81;
    fVar83 = auVar88._4_4_;
    fStack_2bc = (float)local_5c0._4_4_ + fVar83;
    fVar84 = auVar88._8_4_;
    fStack_2b8 = fStack_5b8 + fVar84;
    fVar115 = auVar88._12_4_;
    fStack_2b4 = fStack_5b4 + fVar115;
    fStack_2b0 = fStack_5b0 + 0.0;
    fStack_2ac = fStack_5ac + 0.0;
    fStack_2a8 = fStack_5a8 + 0.0;
    local_200 = ZEXT1632(auVar129);
    auVar15 = vsubps_avx(local_200,auVar249);
    local_220 = vpermps_avx2(_DAT_01fec480,auVar15);
    auVar15 = vsubps_avx(local_240,_local_5c0);
    local_2e0 = vpermps_avx2(_DAT_01fec480,auVar15);
    local_260._0_4_ = auVar87._0_4_ + auVar270._0_4_;
    local_260._4_4_ = auVar87._4_4_ + auVar270._4_4_;
    local_260._8_4_ = auVar87._8_4_ + auVar270._8_4_;
    local_260._12_4_ = auVar87._12_4_ + auVar270._12_4_;
    local_260._16_4_ = auVar270._16_4_ + 0.0;
    local_260._20_4_ = auVar270._20_4_ + 0.0;
    local_260._24_4_ = auVar270._24_4_ + 0.0;
    local_260._28_4_ = 0;
    auVar217 = ZEXT3264(local_260);
    auVar250 = ZEXT1632(auVar87);
    auVar15 = vsubps_avx(auVar250,auVar270);
    _local_5c0 = vpermps_avx2(_DAT_01fec480,auVar15);
    fVar82 = auVar242._0_4_;
    local_2a0 = fVar82 + local_2a0;
    fVar154 = auVar242._4_4_;
    fStack_29c = fVar154 + fStack_29c;
    fVar58 = auVar242._8_4_;
    fStack_298 = fVar58 + fStack_298;
    fVar219 = auVar242._12_4_;
    fStack_294 = fVar219 + fStack_294;
    fStack_290 = fStack_290 + 0.0;
    fStack_28c = fStack_28c + 0.0;
    fStack_288 = fStack_288 + 0.0;
    auVar15 = vsubps_avx(ZEXT1632(auVar242),auVar27);
    local_280 = vpermps_avx2(_DAT_01fec480,auVar15);
    auVar28._4_4_ = fVar83 * fVar253;
    auVar28._0_4_ = fVar81 * fVar252;
    auVar28._8_4_ = fVar84 * fVar185;
    auVar28._12_4_ = fVar115 * fVar186;
    auVar28._16_4_ = fVar187 * 0.0;
    auVar28._20_4_ = fVar188 * 0.0;
    auVar28._24_4_ = fVar189 * 0.0;
    auVar28._28_4_ = auVar15._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar28,local_200,auVar78);
    fStack_2a4 = fVar59 + 0.0;
    auVar29._4_4_ = fStack_2bc * fVar253;
    auVar29._0_4_ = local_2c0 * fVar252;
    auVar29._8_4_ = fStack_2b8 * fVar185;
    auVar29._12_4_ = fStack_2b4 * fVar186;
    auVar29._16_4_ = fStack_2b0 * fVar187;
    auVar29._20_4_ = fStack_2ac * fVar188;
    auVar29._24_4_ = fStack_2a8 * fVar189;
    auVar29._28_4_ = 0;
    auVar9 = vfnmadd231ps_fma(auVar29,auVar78,auVar104);
    auVar30._4_4_ = local_2e0._4_4_ * fVar253;
    auVar30._0_4_ = local_2e0._0_4_ * fVar252;
    auVar30._8_4_ = local_2e0._8_4_ * fVar185;
    auVar30._12_4_ = local_2e0._12_4_ * fVar186;
    auVar30._16_4_ = local_2e0._16_4_ * fVar187;
    auVar30._20_4_ = local_2e0._20_4_ * fVar188;
    auVar30._24_4_ = local_2e0._24_4_ * fVar189;
    auVar30._28_4_ = fVar59 + 0.0;
    auVar121 = vfnmadd231ps_fma(auVar30,local_220,auVar78);
    local_760._0_4_ = auVar17._0_4_;
    local_760._4_4_ = auVar17._4_4_;
    uStack_758._0_4_ = auVar17._8_4_;
    uStack_758._4_4_ = auVar17._12_4_;
    uStack_750._0_4_ = auVar17._16_4_;
    uStack_750._4_4_ = auVar17._20_4_;
    uStack_748._0_4_ = auVar17._24_4_;
    uStack_748._4_4_ = auVar17._28_4_;
    auVar31._4_4_ = (float)local_760._4_4_ * fVar253;
    auVar31._0_4_ = (float)local_760._0_4_ * fVar252;
    auVar31._8_4_ = (float)uStack_758 * fVar185;
    auVar31._12_4_ = uStack_758._4_4_ * fVar186;
    auVar31._16_4_ = (float)uStack_750 * fVar187;
    auVar31._20_4_ = uStack_750._4_4_ * fVar188;
    auVar31._24_4_ = (float)uStack_748 * fVar189;
    auVar31._28_4_ = uStack_748._4_4_;
    auVar106 = vfnmadd231ps_fma(auVar31,auVar16,auVar78);
    auVar201._0_4_ = fVar82 * fVar252;
    auVar201._4_4_ = fVar154 * fVar253;
    auVar201._8_4_ = fVar58 * fVar185;
    auVar201._12_4_ = fVar219 * fVar186;
    auVar201._16_4_ = fVar187 * 0.0;
    auVar201._20_4_ = fVar188 * 0.0;
    auVar201._24_4_ = fVar189 * 0.0;
    auVar201._28_4_ = 0;
    auVar87 = vfnmadd231ps_fma(auVar201,auVar250,auVar78);
    uStack_284 = 0x40400000;
    auVar32._4_4_ = fStack_29c * fVar253;
    auVar32._0_4_ = local_2a0 * fVar252;
    auVar32._8_4_ = fStack_298 * fVar185;
    auVar32._12_4_ = fStack_294 * fVar186;
    auVar32._16_4_ = fStack_290 * fVar187;
    auVar32._20_4_ = fStack_28c * fVar188;
    auVar32._24_4_ = fStack_288 * fVar189;
    auVar32._28_4_ = auVar16._28_4_;
    auVar88 = vfnmadd231ps_fma(auVar32,local_260,auVar78);
    auVar33._4_4_ = local_280._4_4_ * fVar253;
    auVar33._0_4_ = local_280._0_4_ * fVar252;
    auVar33._8_4_ = local_280._8_4_ * fVar185;
    auVar33._12_4_ = local_280._12_4_ * fVar186;
    auVar33._16_4_ = local_280._16_4_ * fVar187;
    auVar33._20_4_ = local_280._20_4_ * fVar188;
    auVar33._24_4_ = local_280._24_4_ * fVar189;
    auVar33._28_4_ = local_280._28_4_;
    auVar130 = vfnmadd231ps_fma(auVar33,_local_5c0,auVar78);
    auVar34._4_4_ = local_4e0._4_4_ * fVar253;
    auVar34._0_4_ = local_4e0._0_4_ * fVar252;
    auVar34._8_4_ = local_4e0._8_4_ * fVar185;
    auVar34._12_4_ = local_4e0._12_4_ * fVar186;
    auVar34._16_4_ = local_4e0._16_4_ * fVar187;
    auVar34._20_4_ = local_4e0._20_4_ * fVar188;
    auVar34._24_4_ = local_4e0._24_4_ * fVar189;
    auVar34._28_4_ = auVar76._28_4_ + auVar77._28_4_;
    auVar234 = vfnmadd231ps_fma(auVar34,auVar18,auVar78);
    auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar76 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar77 = vminps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
    auVar77 = vminps_avx(auVar15,auVar77);
    auVar15 = vmaxps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
    auVar76 = vmaxps_avx(auVar76,auVar15);
    auVar14 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
    auVar15 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
    auVar10 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar234));
    auVar14 = vminps_avx(auVar14,auVar10);
    auVar14 = vminps_avx(auVar77,auVar14);
    auVar77 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar234));
    auVar15 = vmaxps_avx(auVar15,auVar77);
    auVar15 = vmaxps_avx(auVar76,auVar15);
    auVar45._4_4_ = fStack_1bc;
    auVar45._0_4_ = local_1c0;
    auVar45._8_4_ = fStack_1b8;
    auVar45._12_4_ = fStack_1b4;
    auVar45._16_4_ = fStack_1b0;
    auVar45._20_4_ = fStack_1ac;
    auVar45._24_4_ = fStack_1a8;
    auVar45._28_4_ = fStack_1a4;
    auVar76 = vcmpps_avx(auVar14,auVar45,2);
    auVar44._4_4_ = fStack_1dc;
    auVar44._0_4_ = local_1e0;
    auVar44._8_4_ = fStack_1d8;
    auVar44._12_4_ = fStack_1d4;
    auVar44._16_4_ = fStack_1d0;
    auVar44._20_4_ = fStack_1cc;
    auVar44._24_4_ = fStack_1c8;
    auVar44._28_4_ = fStack_1c4;
    auVar15 = vcmpps_avx(auVar15,auVar44,5);
    auVar76 = vandps_avx(auVar15,auVar76);
    auVar15 = local_300 & auVar76;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(auVar16,local_200);
      auVar77 = vsubps_avx(auVar18,auVar250);
      fVar252 = auVar15._0_4_ + auVar77._0_4_;
      fVar253 = auVar15._4_4_ + auVar77._4_4_;
      fVar185 = auVar15._8_4_ + auVar77._8_4_;
      fVar186 = auVar15._12_4_ + auVar77._12_4_;
      fVar187 = auVar15._16_4_ + auVar77._16_4_;
      fVar188 = auVar15._20_4_ + auVar77._20_4_;
      fVar189 = auVar15._24_4_ + auVar77._24_4_;
      auVar14 = vsubps_avx(auVar17,local_240);
      auVar10 = vsubps_avx(local_4e0,ZEXT1632(auVar242));
      auVar105._0_4_ = auVar14._0_4_ + auVar10._0_4_;
      auVar105._4_4_ = auVar14._4_4_ + auVar10._4_4_;
      auVar105._8_4_ = auVar14._8_4_ + auVar10._8_4_;
      auVar105._12_4_ = auVar14._12_4_ + auVar10._12_4_;
      auVar105._16_4_ = auVar14._16_4_ + auVar10._16_4_;
      auVar105._20_4_ = auVar14._20_4_ + auVar10._20_4_;
      auVar105._24_4_ = auVar14._24_4_ + auVar10._24_4_;
      fVar59 = auVar10._28_4_;
      auVar105._28_4_ = auVar14._28_4_ + fVar59;
      auVar35._4_4_ = fVar83 * fVar253;
      auVar35._0_4_ = fVar81 * fVar252;
      auVar35._8_4_ = fVar84 * fVar185;
      auVar35._12_4_ = fVar115 * fVar186;
      auVar35._16_4_ = fVar187 * 0.0;
      auVar35._20_4_ = fVar188 * 0.0;
      auVar35._24_4_ = fVar189 * 0.0;
      auVar35._28_4_ = auVar18._28_4_;
      auVar87 = vfnmadd231ps_fma(auVar35,auVar105,local_200);
      auVar36._4_4_ = fVar253 * fStack_2bc;
      auVar36._0_4_ = fVar252 * local_2c0;
      auVar36._8_4_ = fVar185 * fStack_2b8;
      auVar36._12_4_ = fVar186 * fStack_2b4;
      auVar36._16_4_ = fVar187 * fStack_2b0;
      auVar36._20_4_ = fVar188 * fStack_2ac;
      auVar36._24_4_ = fVar189 * fStack_2a8;
      auVar36._28_4_ = 0;
      auVar8 = vfnmadd213ps_fma(auVar104,auVar105,auVar36);
      auVar37._4_4_ = fVar253 * local_2e0._4_4_;
      auVar37._0_4_ = fVar252 * local_2e0._0_4_;
      auVar37._8_4_ = fVar185 * local_2e0._8_4_;
      auVar37._12_4_ = fVar186 * local_2e0._12_4_;
      auVar37._16_4_ = fVar187 * local_2e0._16_4_;
      auVar37._20_4_ = fVar188 * local_2e0._20_4_;
      auVar37._24_4_ = fVar189 * local_2e0._24_4_;
      auVar37._28_4_ = 0;
      auVar9 = vfnmadd213ps_fma(local_220,auVar105,auVar37);
      auVar38._4_4_ = (float)local_760._4_4_ * fVar253;
      auVar38._0_4_ = (float)local_760._0_4_ * fVar252;
      auVar38._8_4_ = (float)uStack_758 * fVar185;
      auVar38._12_4_ = uStack_758._4_4_ * fVar186;
      auVar38._16_4_ = (float)uStack_750 * fVar187;
      auVar38._20_4_ = uStack_750._4_4_ * fVar188;
      auVar38._24_4_ = (float)uStack_748 * fVar189;
      auVar38._28_4_ = 0;
      auVar242 = vfnmadd231ps_fma(auVar38,auVar105,auVar16);
      auVar126._0_4_ = fVar82 * fVar252;
      auVar126._4_4_ = fVar154 * fVar253;
      auVar126._8_4_ = fVar58 * fVar185;
      auVar126._12_4_ = fVar219 * fVar186;
      auVar126._16_4_ = fVar187 * 0.0;
      auVar126._20_4_ = fVar188 * 0.0;
      auVar126._24_4_ = fVar189 * 0.0;
      auVar126._28_4_ = 0;
      auVar88 = vfnmadd231ps_fma(auVar126,auVar105,auVar250);
      auVar39._4_4_ = fVar253 * fStack_29c;
      auVar39._0_4_ = fVar252 * local_2a0;
      auVar39._8_4_ = fVar185 * fStack_298;
      auVar39._12_4_ = fVar186 * fStack_294;
      auVar39._16_4_ = fVar187 * fStack_290;
      auVar39._20_4_ = fVar188 * fStack_28c;
      auVar39._24_4_ = fVar189 * fStack_288;
      auVar39._28_4_ = fVar59;
      auVar121 = vfnmadd213ps_fma(local_260,auVar105,auVar39);
      auVar40._4_4_ = fVar253 * local_280._4_4_;
      auVar40._0_4_ = fVar252 * local_280._0_4_;
      auVar40._8_4_ = fVar185 * local_280._8_4_;
      auVar40._12_4_ = fVar186 * local_280._12_4_;
      auVar40._16_4_ = fVar187 * local_280._16_4_;
      auVar40._20_4_ = fVar188 * local_280._20_4_;
      auVar40._24_4_ = fVar189 * local_280._24_4_;
      auVar40._28_4_ = fVar59;
      auVar106 = vfnmadd213ps_fma(_local_5c0,auVar105,auVar40);
      auVar217 = ZEXT1664(auVar106);
      auVar41._4_4_ = fVar253 * local_4e0._4_4_;
      auVar41._0_4_ = fVar252 * local_4e0._0_4_;
      auVar41._8_4_ = fVar185 * local_4e0._8_4_;
      auVar41._12_4_ = fVar186 * local_4e0._12_4_;
      auVar41._16_4_ = fVar187 * local_4e0._16_4_;
      auVar41._20_4_ = fVar188 * local_4e0._20_4_;
      auVar41._24_4_ = fVar189 * local_4e0._24_4_;
      auVar41._28_4_ = auVar15._28_4_ + auVar77._28_4_;
      auVar130 = vfnmadd231ps_fma(auVar41,auVar105,auVar18);
      auVar77 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar8));
      auVar15 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar8));
      auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar242));
      auVar14 = vminps_avx(auVar77,auVar14);
      auVar77 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar242));
      auVar15 = vmaxps_avx(auVar15,auVar77);
      auVar10 = vminps_avx(ZEXT1632(auVar88),ZEXT1632(auVar121));
      auVar77 = vmaxps_avx(ZEXT1632(auVar88),ZEXT1632(auVar121));
      auVar16 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar130));
      auVar10 = vminps_avx(auVar10,auVar16);
      auVar10 = vminps_avx(auVar14,auVar10);
      auVar14 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar130));
      auVar77 = vmaxps_avx(auVar77,auVar14);
      auVar77 = vmaxps_avx(auVar15,auVar77);
      auVar15 = vcmpps_avx(auVar10,auVar45,2);
      auVar77 = vcmpps_avx(auVar77,auVar44,5);
      auVar15 = vandps_avx(auVar77,auVar15);
      auVar76 = vandps_avx(auVar76,local_300);
      auVar77 = auVar76 & auVar15;
      if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar77 >> 0x7f,0) != '\0') ||
            (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar77 >> 0xbf,0) != '\0') ||
          (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar77[0x1f] < '\0') {
        auVar76 = vandps_avx(auVar15,auVar76);
        uVar52 = vmovmskps_avx(auVar76);
        if (uVar52 != 0) {
          uVar53 = (ulong)uVar55;
          auStack_4f0[uVar53] = uVar52 & 0xff;
          uVar85 = vmovlps_avx(local_440);
          *(undefined8 *)(&uStack_380 + uVar53 * 2) = uVar85;
          uVar48 = vmovlps_avx(auVar63);
          auStack_1a0[uVar53] = uVar48;
          uVar55 = uVar55 + 1;
        }
      }
    }
    if (uVar55 != 0) {
      do {
        uVar53 = (ulong)(uVar55 - 1);
        uVar51 = auStack_4f0[uVar53];
        uVar52 = (&uStack_380)[uVar53 * 2];
        fVar81 = afStack_37c[uVar53 * 2];
        iVar47 = 0;
        for (uVar48 = (ulong)uVar51; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
          iVar47 = iVar47 + 1;
        }
        uVar51 = uVar51 - 1 & uVar51;
        if (uVar51 == 0) {
          uVar55 = uVar55 - 1;
        }
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_1a0[uVar53];
        auStack_4f0[uVar53] = uVar51;
        fVar83 = (float)(iVar47 + 1) * 0.14285715;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * (float)iVar47 * 0.14285715)),
                                 ZEXT416(uVar52),ZEXT416((uint)(1.0 - (float)iVar47 * 0.14285715)));
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * fVar83)),ZEXT416(uVar52),
                                 ZEXT416((uint)(1.0 - fVar83)));
        fVar83 = auVar9._0_4_;
        fVar84 = auVar8._0_4_;
        fVar81 = fVar83 - fVar84;
        if (0.16666667 <= fVar81) {
          local_440 = vinsertps_avx(auVar8,auVar9,0x10);
          goto LAB_015abb4f;
        }
        auVar121 = vshufps_avx(auVar63,auVar63,0x50);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar106 = vsubps_avx(auVar93,auVar121);
        fVar115 = auVar121._0_4_;
        auVar133._0_4_ = fVar115 * fVar128;
        fVar82 = auVar121._4_4_;
        auVar133._4_4_ = fVar82 * fVar138;
        fVar59 = auVar121._8_4_;
        auVar133._8_4_ = fVar59 * fVar128;
        fVar154 = auVar121._12_4_;
        auVar133._12_4_ = fVar154 * fVar138;
        auVar144._0_4_ = fVar115 * fVar238;
        auVar144._4_4_ = fVar82 * fVar251;
        auVar144._8_4_ = fVar59 * fVar238;
        auVar144._12_4_ = fVar154 * fVar251;
        auVar167._0_4_ = fVar115 * fVar190;
        auVar167._4_4_ = fVar82 * fVar202;
        auVar167._8_4_ = fVar59 * fVar190;
        auVar167._12_4_ = fVar154 * fVar202;
        auVar65._0_4_ = fVar115 * fVar203;
        auVar65._4_4_ = fVar82 * fVar218;
        auVar65._8_4_ = fVar59 * fVar203;
        auVar65._12_4_ = fVar154 * fVar218;
        auVar121 = vfmadd231ps_fma(auVar133,auVar106,auVar178);
        auVar87 = vfmadd231ps_fma(auVar144,auVar106,auVar223);
        auVar242 = vfmadd231ps_fma(auVar167,auVar106,auVar241);
        auVar106 = vfmadd231ps_fma(auVar65,auVar106,auVar256);
        auVar127._16_16_ = auVar121;
        auVar127._0_16_ = auVar121;
        auVar137._16_16_ = auVar87;
        auVar137._0_16_ = auVar87;
        auVar152._16_16_ = auVar242;
        auVar152._0_16_ = auVar242;
        auVar184._4_4_ = fVar84;
        auVar184._0_4_ = fVar84;
        auVar184._8_4_ = fVar84;
        auVar184._12_4_ = fVar84;
        auVar184._20_4_ = fVar83;
        auVar184._16_4_ = fVar83;
        auVar184._24_4_ = fVar83;
        auVar184._28_4_ = fVar83;
        auVar76 = vsubps_avx(auVar137,auVar127);
        auVar87 = vfmadd213ps_fma(auVar76,auVar184,auVar127);
        auVar76 = vsubps_avx(auVar152,auVar137);
        auVar88 = vfmadd213ps_fma(auVar76,auVar184,auVar137);
        auVar121 = vsubps_avx(auVar106,auVar242);
        auVar79._16_16_ = auVar121;
        auVar79._0_16_ = auVar121;
        auVar121 = vfmadd213ps_fma(auVar79,auVar184,auVar152);
        auVar76 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar87));
        auVar106 = vfmadd213ps_fma(auVar76,auVar184,ZEXT1632(auVar87));
        auVar76 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar88));
        auVar121 = vfmadd213ps_fma(auVar76,auVar184,ZEXT1632(auVar88));
        auVar76 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar106));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar76,auVar184);
        fVar219 = auVar76._4_4_ * 3.0;
        fVar115 = fVar81 * 0.33333334;
        local_4e0._0_8_ =
             CONCAT44(auVar86._4_4_ + fVar115 * fVar219,
                      auVar86._0_4_ + fVar115 * auVar76._0_4_ * 3.0);
        local_4e0._8_4_ = auVar86._8_4_ + fVar115 * auVar76._8_4_ * 3.0;
        local_4e0._12_4_ = auVar86._12_4_ + fVar115 * auVar76._12_4_ * 3.0;
        auVar106 = vshufpd_avx(auVar86,auVar86,3);
        auVar87 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar121 = vsubps_avx(auVar106,auVar86);
        auVar242 = vsubps_avx(auVar87,(undefined1  [16])0x0);
        auVar66._0_4_ = auVar121._0_4_ + auVar242._0_4_;
        auVar66._4_4_ = auVar121._4_4_ + auVar242._4_4_;
        auVar66._8_4_ = auVar121._8_4_ + auVar242._8_4_;
        auVar66._12_4_ = auVar121._12_4_ + auVar242._12_4_;
        auVar121 = vshufps_avx(auVar86,auVar86,0xb1);
        auVar242 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
        auVar266._4_4_ = auVar66._0_4_;
        auVar266._0_4_ = auVar66._0_4_;
        auVar266._8_4_ = auVar66._0_4_;
        auVar266._12_4_ = auVar66._0_4_;
        auVar88 = vshufps_avx(auVar66,auVar66,0x55);
        fVar82 = auVar88._0_4_;
        auVar67._0_4_ = fVar82 * auVar121._0_4_;
        fVar59 = auVar88._4_4_;
        auVar67._4_4_ = fVar59 * auVar121._4_4_;
        fVar154 = auVar88._8_4_;
        auVar67._8_4_ = fVar154 * auVar121._8_4_;
        fVar58 = auVar88._12_4_;
        auVar67._12_4_ = fVar58 * auVar121._12_4_;
        auVar145._0_4_ = fVar82 * auVar242._0_4_;
        auVar145._4_4_ = fVar59 * auVar242._4_4_;
        auVar145._8_4_ = fVar154 * auVar242._8_4_;
        auVar145._12_4_ = fVar58 * auVar242._12_4_;
        auVar130 = vfmadd231ps_fma(auVar67,auVar266,auVar86);
        auVar234 = vfmadd231ps_fma(auVar145,auVar266,local_4e0._0_16_);
        auVar242 = vshufps_avx(auVar130,auVar130,0xe8);
        auVar88 = vshufps_avx(auVar234,auVar234,0xe8);
        auVar121 = vcmpps_avx(auVar242,auVar88,1);
        uVar52 = vextractps_avx(auVar121,0);
        auVar129 = auVar234;
        if ((uVar52 & 1) == 0) {
          auVar129 = auVar130;
        }
        auVar117._0_4_ = fVar115 * auVar76._16_4_ * 3.0;
        auVar117._4_4_ = fVar115 * fVar219;
        auVar117._8_4_ = fVar115 * auVar76._24_4_ * 3.0;
        auVar117._12_4_ = fVar115 * auVar217._28_4_;
        auVar175 = vsubps_avx((undefined1  [16])0x0,auVar117);
        auVar118 = vshufps_avx(auVar175,auVar175,0xb1);
        auVar139 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar179._0_4_ = fVar82 * auVar118._0_4_;
        auVar179._4_4_ = fVar59 * auVar118._4_4_;
        auVar179._8_4_ = fVar154 * auVar118._8_4_;
        auVar179._12_4_ = fVar58 * auVar118._12_4_;
        auVar195._0_4_ = auVar139._0_4_ * fVar82;
        auVar195._4_4_ = auVar139._4_4_ * fVar59;
        auVar195._8_4_ = auVar139._8_4_ * fVar154;
        auVar195._12_4_ = auVar139._12_4_ * fVar58;
        _local_5c0 = auVar175;
        auVar191 = vfmadd231ps_fma(auVar179,auVar266,auVar175);
        auVar192 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar266);
        auVar139 = vshufps_avx(auVar191,auVar191,0xe8);
        auVar140 = vshufps_avx(auVar192,auVar192,0xe8);
        auVar217 = ZEXT1664(auVar140);
        auVar118 = vcmpps_avx(auVar139,auVar140,1);
        uVar52 = vextractps_avx(auVar118,0);
        auVar204 = auVar192;
        if ((uVar52 & 1) == 0) {
          auVar204 = auVar191;
        }
        auVar129 = vmaxss_avx(auVar204,auVar129);
        auVar242 = vminps_avx(auVar242,auVar88);
        auVar88 = vminps_avx(auVar139,auVar140);
        auVar88 = vminps_avx(auVar242,auVar88);
        auVar121 = vshufps_avx(auVar121,auVar121,0x55);
        auVar121 = vblendps_avx(auVar121,auVar118,2);
        auVar118 = vpslld_avx(auVar121,0x1f);
        auVar121 = vshufpd_avx(auVar234,auVar234,1);
        auVar121 = vinsertps_avx(auVar121,auVar192,0x9c);
        auVar242 = vshufpd_avx(auVar130,auVar130,1);
        auVar242 = vinsertps_avx(auVar242,auVar191,0x9c);
        auVar121 = vblendvps_avx(auVar242,auVar121,auVar118);
        auVar242 = vmovshdup_avx(auVar121);
        auVar121 = vmaxss_avx(auVar242,auVar121);
        fVar154 = auVar88._0_4_;
        auVar242 = vmovshdup_avx(auVar88);
        fVar59 = auVar121._0_4_;
        fVar115 = auVar242._0_4_;
        fVar82 = auVar129._0_4_;
        if (((fVar154 < 0.0001) && (-0.0001 < fVar59)) || (fVar115 < 0.0001 && -0.0001 < fVar59)) {
LAB_015ac3fb:
          auVar130 = vcmpps_avx(auVar88,_DAT_01f7aa10,1);
          auVar234 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar242 = vcmpss_avx(auVar129,ZEXT816(0) << 0x20,1);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = 0x3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar109._8_4_ = 0xbf800000;
          auVar109._0_8_ = 0xbf800000bf800000;
          auVar109._12_4_ = 0xbf800000;
          auVar242 = vblendvps_avx(auVar94,auVar109,auVar242);
          auVar130 = vblendvps_avx(auVar94,auVar109,auVar130);
          fVar219 = auVar130._0_4_;
          fVar58 = auVar242._0_4_;
          auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar219 == fVar58) && (!NAN(fVar219) && !NAN(fVar58))) {
            auVar242 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar219 == fVar58) && (!NAN(fVar219) && !NAN(fVar58))) {
            auVar234 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar130 = vmovshdup_avx(auVar130);
          fVar252 = auVar130._0_4_;
          if ((fVar219 != fVar252) || (NAN(fVar219) || NAN(fVar252))) {
            if ((fVar115 != fVar154) || (NAN(fVar115) || NAN(fVar154))) {
              auVar119._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar119._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar119._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar120._0_4_ = -fVar154 / (fVar115 - fVar154);
              auVar120._4_12_ = auVar119._4_12_;
              auVar88 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar120._0_4_)),auVar120,ZEXT416(0));
              auVar130 = auVar88;
            }
            else {
              auVar88 = ZEXT816(0) << 0x20;
              if ((fVar154 != 0.0) || (auVar130 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar154))) {
                auVar88 = SUB6416(ZEXT464(0x7f800000),0);
                auVar130 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar242 = vminss_avx(auVar242,auVar88);
            auVar234 = vmaxss_avx(auVar130,auVar234);
          }
          auVar121 = vcmpss_avx(auVar121,ZEXT416(0),1);
          auVar95._8_4_ = 0x3f800000;
          auVar95._0_8_ = 0x3f8000003f800000;
          auVar95._12_4_ = 0x3f800000;
          auVar110._8_4_ = 0xbf800000;
          auVar110._0_8_ = 0xbf800000bf800000;
          auVar110._12_4_ = 0xbf800000;
          auVar121 = vblendvps_avx(auVar95,auVar110,auVar121);
          fVar115 = auVar121._0_4_;
          if ((fVar58 != fVar115) || (NAN(fVar58) || NAN(fVar115))) {
            if ((fVar59 != fVar82) || (NAN(fVar59) || NAN(fVar82))) {
              auVar68._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
              auVar68._8_4_ = auVar129._8_4_ ^ 0x80000000;
              auVar68._12_4_ = auVar129._12_4_ ^ 0x80000000;
              auVar122._0_4_ = -fVar82 / (fVar59 - fVar82);
              auVar122._4_12_ = auVar68._4_12_;
              auVar121 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar122._0_4_)),auVar122,ZEXT416(0));
              auVar88 = auVar121;
            }
            else {
              auVar121 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar82 != 0.0) || (auVar88 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar82))) {
                auVar121 = SUB6416(ZEXT464(0xff800000),0);
                auVar88 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar242 = vminss_avx(auVar242,auVar88);
            auVar234 = vmaxss_avx(auVar121,auVar234);
          }
          if ((fVar252 != fVar115) || (NAN(fVar252) || NAN(fVar115))) {
            auVar242 = vminss_avx(auVar242,SUB6416(ZEXT464(0x3f800000),0));
            auVar234 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar234);
          }
          auVar121 = vmaxss_avx(ZEXT816(0) << 0x40,auVar242);
          auVar242 = vminss_avx(auVar234,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar121._0_4_ <= auVar242._0_4_) {
            auVar121 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar121._0_4_ + -0.1)));
            auVar242 = vminss_avx(ZEXT416((uint)(auVar242._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar134._0_8_ = auVar86._0_8_;
            auVar134._8_8_ = auVar134._0_8_;
            auVar209._8_8_ = local_4e0._0_8_;
            auVar209._0_8_ = local_4e0._0_8_;
            auVar224._8_8_ = auVar175._0_8_;
            auVar224._0_8_ = auVar175._0_8_;
            auVar88 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
            auVar130 = vshufpd_avx(auVar175,auVar175,3);
            auVar234 = vshufps_avx(auVar121,auVar242,0);
            auVar69._8_4_ = 0x3f800000;
            auVar69._0_8_ = 0x3f8000003f800000;
            auVar69._12_4_ = 0x3f800000;
            auVar86 = vsubps_avx(auVar69,auVar234);
            local_640 = auVar106._0_4_;
            fStack_63c = auVar106._4_4_;
            fStack_638 = auVar106._8_4_;
            fStack_634 = auVar106._12_4_;
            fVar115 = auVar234._0_4_;
            auVar70._0_4_ = fVar115 * local_640;
            fVar82 = auVar234._4_4_;
            auVar70._4_4_ = fVar82 * fStack_63c;
            fVar59 = auVar234._8_4_;
            auVar70._8_4_ = fVar59 * fStack_638;
            fVar154 = auVar234._12_4_;
            auVar70._12_4_ = fVar154 * fStack_634;
            auVar168._0_4_ = fVar115 * auVar88._0_4_;
            auVar168._4_4_ = fVar82 * auVar88._4_4_;
            auVar168._8_4_ = fVar59 * auVar88._8_4_;
            auVar168._12_4_ = fVar154 * auVar88._12_4_;
            auVar180._0_4_ = fVar115 * auVar130._0_4_;
            auVar180._4_4_ = fVar82 * auVar130._4_4_;
            auVar180._8_4_ = fVar59 * auVar130._8_4_;
            auVar180._12_4_ = fVar154 * auVar130._12_4_;
            auVar196._0_4_ = fVar115 * auVar87._0_4_;
            auVar196._4_4_ = fVar82 * auVar87._4_4_;
            auVar196._8_4_ = fVar59 * auVar87._8_4_;
            auVar196._12_4_ = fVar154 * auVar87._12_4_;
            auVar88 = vfmadd231ps_fma(auVar70,auVar86,auVar134);
            auVar130 = vfmadd231ps_fma(auVar168,auVar86,auVar209);
            auVar234 = vfmadd231ps_fma(auVar180,auVar86,auVar224);
            auVar86 = vfmadd231ps_fma(auVar196,auVar86,ZEXT816(0));
            auVar106 = vmovshdup_avx(auVar63);
            auVar175 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar121._0_4_)),auVar63,
                                       ZEXT416((uint)(1.0 - auVar121._0_4_)));
            auVar191 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar242._0_4_)),auVar63,
                                       ZEXT416((uint)(1.0 - auVar242._0_4_)));
            fVar115 = 1.0 / fVar81;
            auVar121 = vsubps_avx(auVar130,auVar88);
            auVar210._0_4_ = auVar121._0_4_ * 3.0;
            auVar210._4_4_ = auVar121._4_4_ * 3.0;
            auVar210._8_4_ = auVar121._8_4_ * 3.0;
            auVar210._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar234,auVar130);
            auVar225._0_4_ = auVar121._0_4_ * 3.0;
            auVar225._4_4_ = auVar121._4_4_ * 3.0;
            auVar225._8_4_ = auVar121._8_4_ * 3.0;
            auVar225._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar86,auVar234);
            auVar235._0_4_ = auVar121._0_4_ * 3.0;
            auVar235._4_4_ = auVar121._4_4_ * 3.0;
            auVar235._8_4_ = auVar121._8_4_ * 3.0;
            auVar235._12_4_ = auVar121._12_4_ * 3.0;
            auVar106 = vminps_avx(auVar225,auVar235);
            auVar121 = vmaxps_avx(auVar225,auVar235);
            auVar106 = vminps_avx(auVar210,auVar106);
            auVar121 = vmaxps_avx(auVar210,auVar121);
            auVar87 = vshufpd_avx(auVar106,auVar106,3);
            auVar242 = vshufpd_avx(auVar121,auVar121,3);
            auVar106 = vminps_avx(auVar106,auVar87);
            auVar121 = vmaxps_avx(auVar121,auVar242);
            auVar226._0_4_ = auVar106._0_4_ * fVar115;
            auVar226._4_4_ = auVar106._4_4_ * fVar115;
            auVar226._8_4_ = auVar106._8_4_ * fVar115;
            auVar226._12_4_ = auVar106._12_4_ * fVar115;
            auVar211._0_4_ = auVar121._0_4_ * fVar115;
            auVar211._4_4_ = auVar121._4_4_ * fVar115;
            auVar211._8_4_ = auVar121._8_4_ * fVar115;
            auVar211._12_4_ = auVar121._12_4_ * fVar115;
            fVar115 = 1.0 / (auVar191._0_4_ - auVar175._0_4_);
            auVar121 = vshufpd_avx(auVar88,auVar88,3);
            auVar106 = vshufpd_avx(auVar130,auVar130,3);
            auVar87 = vshufpd_avx(auVar234,auVar234,3);
            auVar242 = vshufpd_avx(auVar86,auVar86,3);
            auVar121 = vsubps_avx(auVar121,auVar88);
            auVar88 = vsubps_avx(auVar106,auVar130);
            auVar130 = vsubps_avx(auVar87,auVar234);
            auVar242 = vsubps_avx(auVar242,auVar86);
            auVar106 = vminps_avx(auVar121,auVar88);
            auVar121 = vmaxps_avx(auVar121,auVar88);
            auVar87 = vminps_avx(auVar130,auVar242);
            auVar87 = vminps_avx(auVar106,auVar87);
            auVar106 = vmaxps_avx(auVar130,auVar242);
            auVar121 = vmaxps_avx(auVar121,auVar106);
            auVar257._0_4_ = fVar115 * auVar87._0_4_;
            auVar257._4_4_ = fVar115 * auVar87._4_4_;
            auVar257._8_4_ = fVar115 * auVar87._8_4_;
            auVar257._12_4_ = fVar115 * auVar87._12_4_;
            auVar243._0_4_ = fVar115 * auVar121._0_4_;
            auVar243._4_4_ = fVar115 * auVar121._4_4_;
            auVar243._8_4_ = fVar115 * auVar121._8_4_;
            auVar243._12_4_ = fVar115 * auVar121._12_4_;
            auVar242 = vinsertps_avx(auVar8,auVar175,0x10);
            auVar88 = vinsertps_avx(auVar9,auVar191,0x10);
            auVar236._0_4_ = (auVar242._0_4_ + auVar88._0_4_) * 0.5;
            auVar236._4_4_ = (auVar242._4_4_ + auVar88._4_4_) * 0.5;
            auVar236._8_4_ = (auVar242._8_4_ + auVar88._8_4_) * 0.5;
            auVar236._12_4_ = (auVar242._12_4_ + auVar88._12_4_) * 0.5;
            auVar71._4_4_ = auVar236._0_4_;
            auVar71._0_4_ = auVar236._0_4_;
            auVar71._8_4_ = auVar236._0_4_;
            auVar71._12_4_ = auVar236._0_4_;
            auVar121 = vfmadd213ps_fma(local_3b0,auVar71,local_500);
            auVar106 = vfmadd213ps_fma(local_3c0,auVar71,auVar11);
            auVar87 = vfmadd213ps_fma(local_3d0,auVar71,auVar12);
            auVar9 = vsubps_avx(auVar106,auVar121);
            auVar121 = vfmadd213ps_fma(auVar9,auVar71,auVar121);
            auVar9 = vsubps_avx(auVar87,auVar106);
            auVar9 = vfmadd213ps_fma(auVar9,auVar71,auVar106);
            auVar9 = vsubps_avx(auVar9,auVar121);
            auVar121 = vfmadd231ps_fma(auVar121,auVar9,auVar71);
            auVar72._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
            auVar72._8_4_ = auVar9._8_4_ * 3.0;
            auVar72._12_4_ = auVar9._12_4_ * 3.0;
            auVar267._8_8_ = auVar121._0_8_;
            auVar267._0_8_ = auVar121._0_8_;
            auVar9 = vshufpd_avx(auVar121,auVar121,3);
            auVar121 = vshufps_avx(auVar236,auVar236,0x55);
            auVar234 = vsubps_avx(auVar9,auVar267);
            auVar129 = vfmadd231ps_fma(auVar267,auVar121,auVar234);
            auVar273._8_8_ = auVar72._0_8_;
            auVar273._0_8_ = auVar72._0_8_;
            auVar9 = vshufpd_avx(auVar72,auVar72,3);
            auVar9 = vsubps_avx(auVar9,auVar273);
            auVar86 = vfmadd213ps_fma(auVar9,auVar121,auVar273);
            auVar121 = vmovshdup_avx(auVar86);
            auVar274._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar274._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar274._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar106 = vmovshdup_avx(auVar234);
            auVar9 = vunpcklps_avx(auVar106,auVar274);
            auVar87 = vshufps_avx(auVar9,auVar274,4);
            auVar130 = vshufps_avx(auVar236,auVar236,0x54);
            auVar123._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
            auVar123._8_4_ = auVar234._8_4_ ^ 0x80000000;
            auVar123._12_4_ = auVar234._12_4_ ^ 0x80000000;
            auVar9 = vmovlhps_avx(auVar123,auVar86);
            auVar9 = vshufps_avx(auVar9,auVar86,8);
            auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar234._0_4_ * auVar121._0_4_)),auVar106,
                                       auVar86);
            uVar57 = auVar121._0_4_;
            auVar73._4_4_ = uVar57;
            auVar73._0_4_ = uVar57;
            auVar73._8_4_ = uVar57;
            auVar73._12_4_ = uVar57;
            auVar121 = vdivps_avx(auVar87,auVar73);
            auVar106 = vdivps_avx(auVar9,auVar73);
            fVar59 = auVar129._0_4_;
            fVar115 = auVar121._0_4_;
            auVar9 = vshufps_avx(auVar129,auVar129,0x55);
            fVar82 = auVar106._0_4_;
            auVar74._0_4_ = fVar59 * fVar115 + auVar9._0_4_ * fVar82;
            auVar74._4_4_ = fVar59 * auVar121._4_4_ + auVar9._4_4_ * auVar106._4_4_;
            auVar74._8_4_ = fVar59 * auVar121._8_4_ + auVar9._8_4_ * auVar106._8_4_;
            auVar74._12_4_ = fVar59 * auVar121._12_4_ + auVar9._12_4_ * auVar106._12_4_;
            auVar140 = vsubps_avx(auVar130,auVar74);
            auVar130 = vmovshdup_avx(auVar121);
            auVar9 = vinsertps_avx(auVar226,auVar257,0x1c);
            auVar146._0_4_ = auVar130._0_4_ * auVar9._0_4_;
            auVar146._4_4_ = auVar130._4_4_ * auVar9._4_4_;
            auVar146._8_4_ = auVar130._8_4_ * auVar9._8_4_;
            auVar146._12_4_ = auVar130._12_4_ * auVar9._12_4_;
            auVar87 = vinsertps_avx(auVar211,auVar243,0x1c);
            auVar96._0_4_ = auVar87._0_4_ * auVar130._0_4_;
            auVar96._4_4_ = auVar87._4_4_ * auVar130._4_4_;
            auVar96._8_4_ = auVar87._8_4_ * auVar130._8_4_;
            auVar96._12_4_ = auVar87._12_4_ * auVar130._12_4_;
            auVar129 = vminps_avx(auVar146,auVar96);
            auVar86 = vmaxps_avx(auVar96,auVar146);
            auVar130 = vinsertps_avx(auVar257,auVar226,0x4c);
            auVar118 = vmovshdup_avx(auVar106);
            auVar234 = vinsertps_avx(auVar243,auVar211,0x4c);
            auVar244._0_4_ = auVar118._0_4_ * auVar130._0_4_;
            auVar244._4_4_ = auVar118._4_4_ * auVar130._4_4_;
            auVar244._8_4_ = auVar118._8_4_ * auVar130._8_4_;
            auVar244._12_4_ = auVar118._12_4_ * auVar130._12_4_;
            auVar227._0_4_ = auVar118._0_4_ * auVar234._0_4_;
            auVar227._4_4_ = auVar118._4_4_ * auVar234._4_4_;
            auVar227._8_4_ = auVar118._8_4_ * auVar234._8_4_;
            auVar227._12_4_ = auVar118._12_4_ * auVar234._12_4_;
            auVar118 = vminps_avx(auVar244,auVar227);
            auVar258._0_4_ = auVar129._0_4_ + auVar118._0_4_;
            auVar258._4_4_ = auVar129._4_4_ + auVar118._4_4_;
            auVar258._8_4_ = auVar129._8_4_ + auVar118._8_4_;
            auVar258._12_4_ = auVar129._12_4_ + auVar118._12_4_;
            auVar129 = vmaxps_avx(auVar227,auVar244);
            auVar97._0_4_ = auVar129._0_4_ + auVar86._0_4_;
            auVar97._4_4_ = auVar129._4_4_ + auVar86._4_4_;
            auVar97._8_4_ = auVar129._8_4_ + auVar86._8_4_;
            auVar97._12_4_ = auVar129._12_4_ + auVar86._12_4_;
            auVar228._8_8_ = 0x3f80000000000000;
            auVar228._0_8_ = 0x3f80000000000000;
            auVar86 = vsubps_avx(auVar228,auVar97);
            auVar129 = vsubps_avx(auVar228,auVar258);
            auVar118 = vsubps_avx(auVar242,auVar236);
            auVar139 = vsubps_avx(auVar88,auVar236);
            auVar111._0_4_ = fVar115 * auVar9._0_4_;
            auVar111._4_4_ = fVar115 * auVar9._4_4_;
            auVar111._8_4_ = fVar115 * auVar9._8_4_;
            auVar111._12_4_ = fVar115 * auVar9._12_4_;
            auVar259._0_4_ = fVar115 * auVar87._0_4_;
            auVar259._4_4_ = fVar115 * auVar87._4_4_;
            auVar259._8_4_ = fVar115 * auVar87._8_4_;
            auVar259._12_4_ = fVar115 * auVar87._12_4_;
            auVar87 = vminps_avx(auVar111,auVar259);
            auVar9 = vmaxps_avx(auVar259,auVar111);
            auVar147._0_4_ = fVar82 * auVar130._0_4_;
            auVar147._4_4_ = fVar82 * auVar130._4_4_;
            auVar147._8_4_ = fVar82 * auVar130._8_4_;
            auVar147._12_4_ = fVar82 * auVar130._12_4_;
            auVar212._0_4_ = fVar82 * auVar234._0_4_;
            auVar212._4_4_ = fVar82 * auVar234._4_4_;
            auVar212._8_4_ = fVar82 * auVar234._8_4_;
            auVar212._12_4_ = fVar82 * auVar234._12_4_;
            auVar130 = vminps_avx(auVar147,auVar212);
            auVar260._0_4_ = auVar87._0_4_ + auVar130._0_4_;
            auVar260._4_4_ = auVar87._4_4_ + auVar130._4_4_;
            auVar260._8_4_ = auVar87._8_4_ + auVar130._8_4_;
            auVar260._12_4_ = auVar87._12_4_ + auVar130._12_4_;
            fVar252 = auVar118._0_4_;
            auVar268._0_4_ = fVar252 * auVar86._0_4_;
            fVar253 = auVar118._4_4_;
            auVar268._4_4_ = fVar253 * auVar86._4_4_;
            fVar185 = auVar118._8_4_;
            auVar268._8_4_ = fVar185 * auVar86._8_4_;
            fVar186 = auVar118._12_4_;
            auVar268._12_4_ = fVar186 * auVar86._12_4_;
            auVar87 = vmaxps_avx(auVar212,auVar147);
            auVar213._0_4_ = fVar252 * auVar129._0_4_;
            auVar213._4_4_ = fVar253 * auVar129._4_4_;
            auVar213._8_4_ = fVar185 * auVar129._8_4_;
            auVar213._12_4_ = fVar186 * auVar129._12_4_;
            fVar59 = auVar139._0_4_;
            auVar98._0_4_ = fVar59 * auVar86._0_4_;
            fVar154 = auVar139._4_4_;
            auVar98._4_4_ = fVar154 * auVar86._4_4_;
            fVar58 = auVar139._8_4_;
            auVar98._8_4_ = fVar58 * auVar86._8_4_;
            fVar219 = auVar139._12_4_;
            auVar98._12_4_ = fVar219 * auVar86._12_4_;
            auVar229._0_4_ = fVar59 * auVar129._0_4_;
            auVar229._4_4_ = fVar154 * auVar129._4_4_;
            auVar229._8_4_ = fVar58 * auVar129._8_4_;
            auVar229._12_4_ = fVar219 * auVar129._12_4_;
            auVar112._0_4_ = auVar9._0_4_ + auVar87._0_4_;
            auVar112._4_4_ = auVar9._4_4_ + auVar87._4_4_;
            auVar112._8_4_ = auVar9._8_4_ + auVar87._8_4_;
            auVar112._12_4_ = auVar9._12_4_ + auVar87._12_4_;
            auVar148._8_8_ = 0x3f800000;
            auVar148._0_8_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar148,auVar112);
            auVar87 = vsubps_avx(auVar148,auVar260);
            auVar261._0_4_ = fVar252 * auVar9._0_4_;
            auVar261._4_4_ = fVar253 * auVar9._4_4_;
            auVar261._8_4_ = fVar185 * auVar9._8_4_;
            auVar261._12_4_ = fVar186 * auVar9._12_4_;
            auVar245._0_4_ = fVar252 * auVar87._0_4_;
            auVar245._4_4_ = fVar253 * auVar87._4_4_;
            auVar245._8_4_ = fVar185 * auVar87._8_4_;
            auVar245._12_4_ = fVar186 * auVar87._12_4_;
            auVar113._0_4_ = fVar59 * auVar9._0_4_;
            auVar113._4_4_ = fVar154 * auVar9._4_4_;
            auVar113._8_4_ = fVar58 * auVar9._8_4_;
            auVar113._12_4_ = fVar219 * auVar9._12_4_;
            auVar149._0_4_ = fVar59 * auVar87._0_4_;
            auVar149._4_4_ = fVar154 * auVar87._4_4_;
            auVar149._8_4_ = fVar58 * auVar87._8_4_;
            auVar149._12_4_ = fVar219 * auVar87._12_4_;
            auVar9 = vminps_avx(auVar261,auVar245);
            auVar87 = vminps_avx(auVar113,auVar149);
            auVar9 = vminps_avx(auVar9,auVar87);
            auVar87 = vmaxps_avx(auVar245,auVar261);
            auVar130 = vmaxps_avx(auVar149,auVar113);
            auVar234 = vminps_avx(auVar268,auVar213);
            auVar86 = vminps_avx(auVar98,auVar229);
            auVar234 = vminps_avx(auVar234,auVar86);
            auVar9 = vhaddps_avx(auVar9,auVar234);
            auVar87 = vmaxps_avx(auVar130,auVar87);
            auVar130 = vmaxps_avx(auVar213,auVar268);
            auVar234 = vmaxps_avx(auVar229,auVar98);
            auVar130 = vmaxps_avx(auVar234,auVar130);
            auVar87 = vhaddps_avx(auVar87,auVar130);
            auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
            auVar87 = vshufps_avx(auVar87,auVar87,0xe8);
            auVar230._0_4_ = auVar140._0_4_ + auVar9._0_4_;
            auVar230._4_4_ = auVar140._4_4_ + auVar9._4_4_;
            auVar230._8_4_ = auVar140._8_4_ + auVar9._8_4_;
            auVar230._12_4_ = auVar140._12_4_ + auVar9._12_4_;
            auVar214._0_4_ = auVar140._0_4_ + auVar87._0_4_;
            auVar214._4_4_ = auVar140._4_4_ + auVar87._4_4_;
            auVar214._8_4_ = auVar140._8_4_ + auVar87._8_4_;
            auVar214._12_4_ = auVar140._12_4_ + auVar87._12_4_;
            auVar217 = ZEXT1664(auVar214);
            auVar9 = vmaxps_avx(auVar242,auVar230);
            auVar87 = vminps_avx(auVar214,auVar88);
            auVar9 = vcmpps_avx(auVar87,auVar9,1);
            auVar9 = vshufps_avx(auVar9,auVar9,0x50);
            if ((auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar9[0xf]) {
              bVar50 = 0;
              if ((fVar84 < auVar230._0_4_) && (bVar50 = 0, auVar214._0_4_ < auVar88._0_4_)) {
                auVar87 = vmovshdup_avx(auVar230);
                auVar9 = vcmpps_avx(auVar214,auVar88,1);
                bVar50 = auVar9[4] & auVar175._0_4_ < auVar87._0_4_;
              }
              if (((3 < uVar55 || fVar81 < 0.001) | bVar50) != 1) goto LAB_015ad072;
              lVar49 = 200;
              do {
                fVar59 = auVar140._0_4_;
                fVar84 = 1.0 - fVar59;
                fVar81 = fVar84 * fVar84 * fVar84;
                fVar83 = fVar59 * 3.0 * fVar84 * fVar84;
                fVar84 = fVar84 * fVar59 * fVar59 * 3.0;
                auVar135._4_4_ = fVar81;
                auVar135._0_4_ = fVar81;
                auVar135._8_4_ = fVar81;
                auVar135._12_4_ = fVar81;
                auVar114._4_4_ = fVar83;
                auVar114._0_4_ = fVar83;
                auVar114._8_4_ = fVar83;
                auVar114._12_4_ = fVar83;
                auVar99._4_4_ = fVar84;
                auVar99._0_4_ = fVar84;
                auVar99._8_4_ = fVar84;
                auVar99._12_4_ = fVar84;
                fVar59 = fVar59 * fVar59 * fVar59;
                auVar150._0_4_ = fVar59 * (float)local_390._0_4_;
                auVar150._4_4_ = fVar59 * (float)local_390._4_4_;
                auVar150._8_4_ = fVar59 * fStack_388;
                auVar150._12_4_ = fVar59 * fStack_384;
                auVar8 = vfmadd231ps_fma(auVar150,auVar99,auVar12);
                auVar8 = vfmadd231ps_fma(auVar8,auVar114,auVar11);
                auVar8 = vfmadd231ps_fma(auVar8,local_500,auVar135);
                auVar100._8_8_ = auVar8._0_8_;
                auVar100._0_8_ = auVar8._0_8_;
                auVar8 = vshufpd_avx(auVar8,auVar8,3);
                auVar9 = vshufps_avx(auVar140,auVar140,0x55);
                auVar8 = vsubps_avx(auVar8,auVar100);
                auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar100);
                fVar81 = auVar9._0_4_;
                auVar8 = vshufps_avx(auVar9,auVar9,0x55);
                auVar101._0_4_ = fVar115 * fVar81 + fVar82 * auVar8._0_4_;
                auVar101._4_4_ = auVar121._4_4_ * fVar81 + auVar106._4_4_ * auVar8._4_4_;
                auVar101._8_4_ = auVar121._8_4_ * fVar81 + auVar106._8_4_ * auVar8._8_4_;
                auVar101._12_4_ = auVar121._12_4_ * fVar81 + auVar106._12_4_ * auVar8._12_4_;
                auVar140 = vsubps_avx(auVar140,auVar101);
                auVar8 = vandps_avx(local_510,auVar9);
                auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
                auVar8 = vmaxss_avx(auVar9,auVar8);
                if (auVar8._0_4_ < (float)local_3a0._0_4_) {
                  local_120 = auVar140._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar8 = vmovshdup_avx(auVar140);
                  fVar81 = auVar8._0_4_;
                  if ((fVar81 < 0.0) || (1.0 < fVar81)) break;
                  auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                         ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar234 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar9 = vdpps_avx(auVar234,local_520,0x7f);
                  auVar121 = vdpps_avx(auVar234,local_530,0x7f);
                  auVar106 = vdpps_avx(auVar234,local_3e0,0x7f);
                  auVar87 = vdpps_avx(auVar234,local_3f0,0x7f);
                  auVar242 = vdpps_avx(auVar234,local_400,0x7f);
                  auVar88 = vdpps_avx(auVar234,local_410,0x7f);
                  auVar130 = vdpps_avx(auVar234,local_420,0x7f);
                  auVar234 = vdpps_avx(auVar234,local_430,0x7f);
                  fVar83 = 1.0 - fVar81;
                  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * auVar242._0_4_)),
                                           ZEXT416((uint)fVar83),auVar9);
                  auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ * fVar81)),
                                             ZEXT416((uint)fVar83),auVar121);
                  auVar217 = ZEXT1664(auVar121);
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar130._0_4_ * fVar81)),
                                             ZEXT416((uint)fVar83),auVar106);
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * auVar234._0_4_)),
                                            ZEXT416((uint)fVar83),auVar87);
                  fVar82 = 1.0 - local_120;
                  fVar83 = fVar82 * local_120 * local_120 * 3.0;
                  fVar154 = local_120 * local_120 * local_120;
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * auVar87._0_4_)),
                                             ZEXT416((uint)fVar83),auVar106);
                  fVar84 = local_120 * 3.0 * fVar82 * fVar82;
                  auVar121 = vfmadd231ss_fma(auVar106,ZEXT416((uint)fVar84),auVar121);
                  fVar115 = fVar82 * fVar82 * fVar82;
                  auVar9 = vfmadd231ss_fma(auVar121,ZEXT416((uint)fVar115),auVar9);
                  fVar59 = auVar9._0_4_;
                  if (((fVar59 < fVar56) ||
                      (fVar58 = *(float *)(ray + k * 4 + 0x100), fVar58 < fVar59)) ||
                     (pGVar4 = (context->scene->geometries).items[uVar46].ptr,
                     (pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar9 = vshufps_avx(auVar140,auVar140,0x55);
                  auVar215._8_4_ = 0x3f800000;
                  auVar215._0_8_ = 0x3f8000003f800000;
                  auVar215._12_4_ = 0x3f800000;
                  auVar121 = vsubps_avx(auVar215,auVar9);
                  fVar219 = auVar9._0_4_;
                  auVar231._0_4_ = fVar219 * (float)local_550._0_4_;
                  fVar252 = auVar9._4_4_;
                  auVar231._4_4_ = fVar252 * (float)local_550._4_4_;
                  fVar253 = auVar9._8_4_;
                  auVar231._8_4_ = fVar253 * fStack_548;
                  fVar185 = auVar9._12_4_;
                  auVar231._12_4_ = fVar185 * fStack_544;
                  auVar237._0_4_ = fVar219 * (float)local_590._0_4_;
                  auVar237._4_4_ = fVar252 * (float)local_590._4_4_;
                  auVar237._8_4_ = fVar253 * fStack_588;
                  auVar237._12_4_ = fVar185 * fStack_584;
                  auVar246._0_4_ = fVar219 * (float)local_5a0._0_4_;
                  auVar246._4_4_ = fVar252 * (float)local_5a0._4_4_;
                  auVar246._8_4_ = fVar253 * fStack_598;
                  auVar246._12_4_ = fVar185 * fStack_594;
                  auVar197._0_4_ = fVar219 * fVar153;
                  auVar197._4_4_ = fVar252 * fVar172;
                  auVar197._8_4_ = fVar253 * fVar173;
                  auVar197._12_4_ = fVar185 * fVar174;
                  auVar9 = vfmadd231ps_fma(auVar231,auVar121,local_540);
                  auVar106 = vfmadd231ps_fma(auVar237,auVar121,local_570);
                  auVar87 = vfmadd231ps_fma(auVar246,auVar121,local_580);
                  auVar242 = vfmadd231ps_fma(auVar197,auVar121,local_560);
                  auVar121 = vsubps_avx(auVar106,auVar9);
                  auVar217 = ZEXT1664(auVar121);
                  auVar9 = vsubps_avx(auVar87,auVar106);
                  auVar106 = vsubps_avx(auVar242,auVar87);
                  auVar247._0_4_ = local_120 * auVar9._0_4_;
                  auVar247._4_4_ = local_120 * auVar9._4_4_;
                  auVar247._8_4_ = local_120 * auVar9._8_4_;
                  auVar247._12_4_ = local_120 * auVar9._12_4_;
                  auVar181._4_4_ = fVar82;
                  auVar181._0_4_ = fVar82;
                  auVar181._8_4_ = fVar82;
                  auVar181._12_4_ = fVar82;
                  auVar87 = vfmadd231ps_fma(auVar247,auVar181,auVar121);
                  auVar198._0_4_ = local_120 * auVar106._0_4_;
                  auVar198._4_4_ = local_120 * auVar106._4_4_;
                  auVar198._8_4_ = local_120 * auVar106._8_4_;
                  auVar198._12_4_ = local_120 * auVar106._12_4_;
                  auVar9 = vfmadd231ps_fma(auVar198,auVar181,auVar9);
                  auVar199._0_4_ = local_120 * auVar9._0_4_;
                  auVar199._4_4_ = local_120 * auVar9._4_4_;
                  auVar199._8_4_ = local_120 * auVar9._8_4_;
                  auVar199._12_4_ = local_120 * auVar9._12_4_;
                  auVar106 = vfmadd231ps_fma(auVar199,auVar181,auVar87);
                  auVar169._0_4_ = fVar154 * (float)local_480._0_4_;
                  auVar169._4_4_ = fVar154 * (float)local_480._4_4_;
                  auVar169._8_4_ = fVar154 * fStack_478;
                  auVar169._12_4_ = fVar154 * fStack_474;
                  auVar124._4_4_ = fVar83;
                  auVar124._0_4_ = fVar83;
                  auVar124._8_4_ = fVar83;
                  auVar124._12_4_ = fVar83;
                  auVar9 = vfmadd132ps_fma(auVar124,auVar169,local_470);
                  auVar151._4_4_ = fVar84;
                  auVar151._0_4_ = fVar84;
                  auVar151._8_4_ = fVar84;
                  auVar151._12_4_ = fVar84;
                  auVar9 = vfmadd132ps_fma(auVar151,auVar9,local_460);
                  auVar170._0_4_ = auVar106._0_4_ * 3.0;
                  auVar170._4_4_ = auVar106._4_4_ * 3.0;
                  auVar170._8_4_ = auVar106._8_4_ * 3.0;
                  auVar170._12_4_ = auVar106._12_4_ * 3.0;
                  auVar136._4_4_ = fVar115;
                  auVar136._0_4_ = fVar115;
                  auVar136._8_4_ = fVar115;
                  auVar136._12_4_ = fVar115;
                  auVar106 = vfmadd132ps_fma(auVar136,auVar9,local_450);
                  auVar9 = vshufps_avx(auVar170,auVar170,0xc9);
                  auVar125._0_4_ = auVar106._0_4_ * auVar9._0_4_;
                  auVar125._4_4_ = auVar106._4_4_ * auVar9._4_4_;
                  auVar125._8_4_ = auVar106._8_4_ * auVar9._8_4_;
                  auVar125._12_4_ = auVar106._12_4_ * auVar9._12_4_;
                  auVar9 = vshufps_avx(auVar106,auVar106,0xc9);
                  auVar9 = vfmsub231ps_fma(auVar125,auVar170,auVar9);
                  local_140 = auVar9._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar59;
                    uVar57 = vextractps_avx(auVar9,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar57;
                    uVar57 = vextractps_avx(auVar9,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar57;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar81;
                    *(uint *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar46;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar8._0_8_;
                  auVar8 = vmovshdup_avx(auVar9);
                  local_180 = auVar8._0_8_;
                  auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
                  local_160 = auVar8._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_33c,local_340);
                  uStack_d8 = CONCAT44(uStack_334,uStack_338);
                  uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                  uStack_c8 = CONCAT44(uStack_324,uStack_328);
                  local_c0._4_4_ = uStack_31c;
                  local_c0._0_4_ = local_320;
                  local_c0._8_4_ = uStack_318;
                  local_c0._12_4_ = uStack_314;
                  local_c0._16_4_ = uStack_310;
                  local_c0._20_4_ = uStack_30c;
                  local_c0._24_4_ = uStack_308;
                  local_c0._28_4_ = uStack_304;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar59;
                  local_4c0 = local_360;
                  local_5f0.valid = (int *)local_4c0;
                  local_5f0.geometryUserPtr = pGVar4->userPtr;
                  local_5f0.context = context->user;
                  local_5f0.hit = (RTCHitN *)&local_180;
                  local_5f0.N = 8;
                  local_5f0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar217 = ZEXT1664(auVar121);
                    (*pGVar4->intersectionFilterN)(&local_5f0);
                  }
                  auVar76 = vpcmpeqd_avx2(local_4c0,_DAT_01faff00);
                  auVar76 = _DAT_01fe9960 & ~auVar76;
                  if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar76 >> 0x7f,0) != '\0') ||
                        (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar76 >> 0xbf,0) != '\0') ||
                      (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar76[0x1f] < '\0') {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar217 = ZEXT1664(auVar217._0_16_);
                      (*p_Var5)(&local_5f0);
                    }
                    auVar15 = vpcmpeqd_avx2(local_4c0,_DAT_01faff00);
                    auVar76 = _DAT_01fe9960 & ~auVar15;
                    if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar76 >> 0x7f,0) != '\0') ||
                          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar76 >> 0xbf,0) != '\0') ||
                        (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar76[0x1f] < '\0') {
                      auVar80._0_8_ = auVar15._0_8_ ^ 0xffffffffffffffff;
                      auVar80._8_4_ = auVar15._8_4_ ^ 0xffffffff;
                      auVar80._12_4_ = auVar15._12_4_ ^ 0xffffffff;
                      auVar80._16_4_ = auVar15._16_4_ ^ 0xffffffff;
                      auVar80._20_4_ = auVar15._20_4_ ^ 0xffffffff;
                      auVar80._24_4_ = auVar15._24_4_ ^ 0xffffffff;
                      auVar80._28_4_ = auVar15._28_4_ ^ 0xffffffff;
                      auVar76 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])local_5f0.hit);
                      *(undefined1 (*) [32])(local_5f0.ray + 0x180) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1a0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1c0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1e0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x200) = auVar76;
                      auVar76 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x220) = auVar76;
                      auVar76 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x240) = auVar76;
                      auVar76 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])(local_5f0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x260) = auVar76;
                      auVar76 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])
                                                         (local_5f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_5f0.ray + 0x280) = auVar76;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar58;
                  break;
                }
                lVar49 = lVar49 + -1;
              } while (lVar49 != 0);
            }
          }
        }
        else {
          auVar242 = vcmpps_avx(auVar242,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar130 = vcmpps_avx(auVar88,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar242 = vandps_avx(auVar130,auVar242);
          if (-0.0001 < fVar82 && (auVar242 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015ac3fb;
        }
        if (uVar55 == 0) break;
      } while( true );
    }
    uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar75._4_4_ = uVar57;
    auVar75._0_4_ = uVar57;
    auVar75._8_4_ = uVar57;
    auVar75._12_4_ = uVar57;
    auVar8 = vcmpps_avx(local_490,auVar75,2);
    uVar46 = vmovmskps_avx(auVar8);
    uVar46 = (uint)uVar54 & uVar46;
    if (uVar46 == 0) {
      return;
    }
  } while( true );
LAB_015ad072:
  local_440 = vinsertps_avx(auVar8,ZEXT416((uint)fVar83),0x10);
  auVar63 = vinsertps_avx(auVar175,ZEXT416((uint)auVar191._0_4_),0x10);
  goto LAB_015abb4f;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }